

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

void __thiscall LexerTest_ClassifyInt_Test::TestBody(LexerTest_ClassifyInt_Test *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 uVar3;
  byte extraout_var;
  internal extraout_var_00;
  internal extraout_var_01;
  internal extraout_var_02;
  internal extraout_var_03;
  internal extraout_var_04;
  internal extraout_var_05;
  internal extraout_var_06;
  internal extraout_var_07;
  internal extraout_var_08;
  internal extraout_var_09;
  internal extraout_var_10;
  internal extraout_var_11;
  internal extraout_var_12;
  internal extraout_var_13;
  internal extraout_var_14;
  internal extraout_var_15;
  internal extraout_var_16;
  internal extraout_var_17;
  internal extraout_var_18;
  internal extraout_var_19;
  internal extraout_var_20;
  internal extraout_var_21;
  internal extraout_var_22;
  internal extraout_var_23;
  internal extraout_var_24;
  internal extraout_var_25;
  internal extraout_var_26;
  internal extraout_var_27;
  internal extraout_var_28;
  internal extraout_var_29;
  ulong uVar4;
  internal extraout_DL;
  internal extraout_DL_00;
  byte extraout_DL_01;
  internal extraout_DL_02;
  byte extraout_DL_03;
  internal extraout_DL_04;
  internal extraout_DL_05;
  internal extraout_DL_06;
  internal extraout_DL_07;
  internal extraout_DL_08;
  byte extraout_DL_09;
  internal extraout_DL_10;
  byte extraout_DL_11;
  internal extraout_DL_12;
  byte extraout_DL_13;
  internal extraout_DL_14;
  byte extraout_DL_15;
  internal extraout_DL_16;
  internal extraout_DL_17;
  internal extraout_DL_18;
  internal extraout_DL_19;
  internal extraout_DL_20;
  byte extraout_DL_21;
  internal extraout_DL_22;
  byte extraout_DL_23;
  internal extraout_DL_24;
  internal extraout_DL_25;
  internal extraout_DL_26;
  byte extraout_DL_27;
  internal extraout_DL_28;
  byte extraout_DL_29;
  internal extraout_DL_30;
  internal extraout_DL_31;
  internal extraout_DL_32;
  byte extraout_DL_33;
  byte extraout_DL_34;
  char *pcVar5;
  char *in_R9;
  long lVar6;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  string_view buffer;
  string_view buffer_00;
  string_view buffer_01;
  string_view buffer_02;
  string_view buffer_03;
  string_view buffer_04;
  string_view buffer_05;
  string_view buffer_06;
  string_view buffer_07;
  string_view buffer_08;
  string_view buffer_09;
  string_view buffer_10;
  string_view buffer_11;
  string_view buffer_12;
  string_view buffer_13;
  string_view buffer_14;
  string_view buffer_15;
  string_view buffer_16;
  string_view buffer_17;
  string_view buffer_18;
  string_view buffer_19;
  string_view buffer_20;
  string_view buffer_21;
  string_view buffer_22;
  string_view buffer_23;
  string_view buffer_24;
  string_view buffer_25;
  string_view buffer_26;
  string_view buffer_27;
  string_view buffer_28;
  string_view buffer_29;
  string_view buffer_30;
  string_view buffer_31;
  string_view buffer_32;
  string_view buffer_33;
  string_view buffer_34;
  string_view buffer_35;
  string_view buffer_36;
  string_view buffer_37;
  string_view buffer_38;
  string_view buffer_39;
  string_view buffer_40;
  string_view buffer_41;
  string_view buffer_42;
  string_view buffer_43;
  string_view buffer_44;
  string_view buffer_45;
  string_view buffer_46;
  string_view buffer_47;
  string_view buffer_48;
  string_view buffer_49;
  string_view buffer_50;
  string_view buffer_51;
  string_view buffer_52;
  string_view buffer_53;
  string_view buffer_54;
  string_view buffer_55;
  string_view buffer_56;
  string_view buffer_57;
  string_view buffer_58;
  string_view buffer_59;
  string_view buffer_60;
  string_view buffer_61;
  string_view buffer_62;
  string_view buffer_63;
  string_view buffer_64;
  string_view buffer_65;
  string_view buffer_66;
  string_view buffer_67;
  string_view buffer_68;
  string_view buffer_69;
  string_view buffer_70;
  string_view buffer_71;
  string_view buffer_72;
  string_view buffer_73;
  string_view buffer_74;
  string_view buffer_75;
  string_view buffer_76;
  string_view buffer_77;
  string_view buffer_78;
  string_view buffer_79;
  string_view buffer_80;
  string_view buffer_81;
  string_view buffer_82;
  string_view buffer_83;
  string_view buffer_84;
  string_view buffer_85;
  string_view buffer_86;
  string_view buffer_87;
  string_view buffer_88;
  string_view buffer_89;
  string_view buffer_90;
  string_view buffer_91;
  string_view buffer_92;
  string_view buffer_93;
  string_view buffer_94;
  string_view buffer_95;
  string_view buffer_96;
  string_view buffer_97;
  string_view buffer_98;
  string_view buffer_99;
  string_view buffer_x00100;
  string_view buffer_x00101;
  string_view buffer_x00102;
  string_view buffer_x00103;
  string_view buffer_x00104;
  string_view buffer_x00105;
  string_view buffer_x00106;
  string_view buffer_x00107;
  string_view buffer_x00108;
  string_view buffer_x00109;
  string_view buffer_x00110;
  string_view buffer_x00111;
  string_view buffer_x00112;
  string_view buffer_x00113;
  string_view buffer_x00114;
  string_view buffer_x00115;
  string_view buffer_x00116;
  string_view buffer_x00117;
  string_view buffer_x00118;
  string_view buffer_x00119;
  string_view buffer_x00120;
  string_view buffer_x00121;
  string_view buffer_x00122;
  string_view buffer_x00123;
  string_view buffer_x00124;
  string_view buffer_x00125;
  string_view buffer_x00126;
  string_view buffer_x00127;
  string_view buffer_x00128;
  string_view buffer_x00129;
  string_view buffer_x00130;
  string_view buffer_x00131;
  string_view buffer_x00132;
  string_view buffer_x00133;
  string_view buffer_x00134;
  string_view buffer_x00135;
  string_view buffer_x00136;
  string_view buffer_x00137;
  string_view buffer_x00138;
  string_view buffer_x00139;
  string_view buffer_x00140;
  string_view buffer_x00141;
  string_view buffer_x00142;
  string_view buffer_x00143;
  string_view buffer_x00144;
  string_view buffer_x00145;
  string_view buffer_x00146;
  string_view buffer_x00147;
  string_view buffer_x00148;
  string_view buffer_x00149;
  string_view buffer_x00150;
  string_view buffer_x00151;
  string_view buffer_x00152;
  string_view buffer_x00153;
  string_view buffer_x00154;
  string_view buffer_x00155;
  string_view buffer_x00156;
  string_view buffer_x00157;
  string_view buffer_x00158;
  string_view buffer_x00159;
  string_view buffer_x00160;
  string_view buffer_x00161;
  string_view buffer_x00162;
  string_view buffer_x00163;
  string_view buffer_x00164;
  string_view buffer_x00165;
  string_view buffer_x00166;
  string_view buffer_x00167;
  string_view buffer_x00168;
  string_view buffer_x00169;
  string_view buffer_x00170;
  string_view buffer_x00171;
  string_view buffer_x00172;
  string_view buffer_x00173;
  string_view buffer_x00174;
  string_view buffer_x00175;
  string_view buffer_x00176;
  string_view buffer_x00177;
  string_view buffer_x00178;
  string_view buffer_x00179;
  string_view buffer_x00180;
  string_view buffer_x00181;
  string_view buffer_x00182;
  string_view buffer_x00183;
  string_view buffer_x00184;
  string_view buffer_x00185;
  string_view buffer_x00186;
  string_view buffer_x00187;
  string_view buffer_x00188;
  string_view buffer_x00189;
  string_view buffer_x00190;
  string_view buffer_x00191;
  string_view buffer_x00192;
  string_view buffer_x00193;
  string_view buffer_x00194;
  string_view buffer_x00195;
  string_view buffer_x00196;
  string_view buffer_x00197;
  string_view buffer_x00198;
  string_view buffer_x00199;
  string_view buffer_x00200;
  string_view buffer_x00201;
  string_view buffer_x00202;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2090;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2068;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2040;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2018;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ff0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1fc8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1fa0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f78;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f50;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f28;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f00;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ed8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1eb0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e88;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e60;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e38;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e10;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1de8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1dc0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d98;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d70;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d48;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d20;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1cf8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1cd0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ca8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c80;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c58;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c30;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c08;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1be0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1bb8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b90;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b68;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b40;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b18;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1af0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ac8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1aa0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a78;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a50;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a28;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a00;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_19d8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_19b0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1988;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1960;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1938;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1910;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18e8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1898;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1870;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1848;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1820;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17f8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17d0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17a8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1780;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1758;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1730;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1708;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_16e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_16b8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1690;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1668;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1640;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1618;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_15f0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_15c8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_15a0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1578;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1550;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1528;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1500;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_14d8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_14b0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1488;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1460;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1438;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1410;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13e8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1398;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1370;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1348;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1320;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12f8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12d0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12a8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1280;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1258;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1230;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1208;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_11e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_11b8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1190;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1168;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1140;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1118;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10f0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10c8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10a0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1078;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1050;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1028;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1000;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fd8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fb0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f88;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f60;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f38;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f10;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ee8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ec0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e98;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e70;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e48;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e20;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_df8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_dd0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_da8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d80;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d58;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d30;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d08;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ce0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_cb8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c90;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c68;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c40;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c18;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bf0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bc8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ba0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b78;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b50;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b28;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b00;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ad8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ab0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a88;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a60;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a38;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a10;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9e8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_998;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_970;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_948;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_920;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8d0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8a8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_880;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_858;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_830;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_808;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_790;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_768;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_740;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_718;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6f0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6c8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_678;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_650;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_628;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_600;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5b0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_588;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_560;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_510;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_498;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_448;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  Lexer local_b0;
  internal local_58 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_38;
  
  local_2090._M_engaged = false;
  buffer._M_str = "0";
  buffer._M_len = 1;
  ::wasm::WATParser::Lexer::Lexer
            (&local_b0,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2090);
  local_58[0] = (internal)(local_b0.pos != local_b0.buffer._M_len);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_2090);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,local_58,(AssertionResult *)"Lexer(\"0\"sv).empty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xfb,(char *)local_b0.pos);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    local_2068._M_engaged = false;
    buffer_00._M_str = "0";
    buffer_00._M_len = 1;
    ::wasm::WATParser::Lexer::Lexer
              (&local_b0,buffer_00,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_2068);
    ::wasm::WATParser::Lexer::takeU<unsigned_long>();
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    local_58[0] = extraout_DL;
    ::wasm::WATParser::Lexer::~Lexer(&local_b0);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_2068);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar_.message_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_b0,local_58,(AssertionResult *)0x258b1d,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0xfc,(char *)local_b0.pos);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      local_2040._M_engaged = false;
      buffer_01._M_str = "0";
      buffer_01._M_len = 1;
      ::wasm::WATParser::Lexer::Lexer
                (&local_b0,buffer_01,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2040);
      ::wasm::WATParser::Lexer::takeI<unsigned_long>();
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_58[0] = extraout_DL_00;
      ::wasm::WATParser::Lexer::~Lexer(&local_b0);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_2040);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_b0,local_58,(AssertionResult *)0x258b35,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0xfd,(char *)local_b0.pos);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar_);
        local_2018._M_engaged = false;
        buffer_02._M_str = "0";
        buffer_02._M_len = 1;
        ::wasm::WATParser::Lexer::Lexer
                  (&local_b0,buffer_02,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2018);
        ::wasm::WATParser::Lexer::takeU<unsigned_int>();
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        local_58[0] = extraout_var_00;
        ::wasm::WATParser::Lexer::~Lexer(&local_b0);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(&local_2018);
        if (local_58[0] == (internal)0x0) {
          testing::Message::Message((Message *)&gtest_ar_.message_);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_b0,local_58,(AssertionResult *)0x258b4d,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0xfe,(char *)local_b0.pos);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar_);
          local_1ff0._M_engaged = false;
          buffer_03._M_str = "0";
          buffer_03._M_len = 1;
          ::wasm::WATParser::Lexer::Lexer
                    (&local_b0,buffer_03,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1ff0);
          ::wasm::WATParser::Lexer::takeI<unsigned_int>();
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          local_58[0] = extraout_var_01;
          ::wasm::WATParser::Lexer::~Lexer(&local_b0);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_1ff0);
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message((Message *)&gtest_ar_.message_);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_b0,local_58,(AssertionResult *)0x258b65,"false","true",in_R9
                      );
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0xff,(char *)local_b0.pos);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar_);
            local_1fc8._M_engaged = false;
            buffer_04._M_str = "0";
            buffer_04._M_len = 1;
            ::wasm::WATParser::Lexer::Lexer
                      (&local_b0,buffer_04,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1fc8);
            local_58[0] = (internal)::wasm::WATParser::Lexer::takeF64();
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            ::wasm::WATParser::Lexer::~Lexer(&local_b0);
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset(&local_1fc8);
            if (local_58[0] == (internal)0x0) {
              testing::Message::Message((Message *)&gtest_ar_.message_);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_b0,local_58,(AssertionResult *)0x258b7d,"false","true",
                         in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x100,(char *)local_b0.pos);
              testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar_.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&gtest_ar_);
              local_1fa0._M_engaged = false;
              buffer_05._M_str = "0";
              buffer_05._M_len = 1;
              ::wasm::WATParser::Lexer::Lexer
                        (&local_b0,buffer_05,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_1fa0);
              ::wasm::WATParser::Lexer::takeF32();
              gtest_ar_.success_ = false;
              gtest_ar_._1_7_ = 0;
              local_58[0] = extraout_var_02;
              ::wasm::WATParser::Lexer::~Lexer(&local_b0);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset(&local_1fa0);
              if (local_58[0] == (internal)0x0) {
                testing::Message::Message((Message *)&gtest_ar_.message_);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&local_b0,local_58,(AssertionResult *)0x258b95,"false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_38,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x101,(char *)local_b0.pos);
                testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar_.message_)
                ;
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar_);
                local_1f78._M_engaged = false;
                buffer_06._M_str = "0";
                buffer_06._M_len = 1;
                ::wasm::WATParser::Lexer::Lexer
                          (&local_b0,buffer_06,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1f78);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )::wasm::WATParser::Lexer::takeU<unsigned_long>();
                local_38.data_ = (AssertHelperData *)0x0;
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long_long>
                          (local_58,"*Lexer(\"0\"sv).takeU64()","0ull",
                           (unsigned_long *)&gtest_ar_.message_,(unsigned_long_long *)&local_38);
                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset(&local_1f78);
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_b0);
                  if (gtest_ar_._0_8_ == 0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = *(char **)gtest_ar_._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x102,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if ((long *)local_b0.pos != (long *)0x0) {
                    (**(code **)(*(long *)local_b0.pos + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar_);
                local_1f50._M_engaged = false;
                buffer_07._M_str = "0";
                buffer_07._M_len = 1;
                ::wasm::WATParser::Lexer::Lexer
                          (&local_b0,buffer_07,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1f50);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                local_38.data_ = (AssertHelperData *)0x0;
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long_long>
                          (local_58,"*Lexer(\"0\"sv).takeI64()","0ull",
                           (unsigned_long *)&gtest_ar_.message_,(unsigned_long_long *)&local_38);
                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset(&local_1f50);
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_b0);
                  if (gtest_ar_._0_8_ == 0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = *(char **)gtest_ar_._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x103,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if ((long *)local_b0.pos != (long *)0x0) {
                    (**(code **)(*(long *)local_b0.pos + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar_);
                local_1f28._M_engaged = false;
                buffer_08._M_str = "0";
                buffer_08._M_len = 1;
                ::wasm::WATParser::Lexer::Lexer
                          (&local_b0,buffer_08,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1f28);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )::wasm::WATParser::Lexer::takeU<unsigned_int>();
                local_38.data_ = local_38.data_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                          (local_58,"*Lexer(\"0\"sv).takeU32()","0u",(uint *)&gtest_ar_.message_,
                           (uint *)&local_38);
                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset(&local_1f28);
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_b0);
                  if (gtest_ar_._0_8_ == 0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = *(char **)gtest_ar_._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x104,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if ((long *)local_b0.pos != (long *)0x0) {
                    (**(code **)(*(long *)local_b0.pos + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar_);
                local_1f00._M_engaged = false;
                buffer_09._M_str = "0";
                buffer_09._M_len = 1;
                ::wasm::WATParser::Lexer::Lexer
                          (&local_b0,buffer_09,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1f00);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )::wasm::WATParser::Lexer::takeI<unsigned_int>();
                local_38.data_ = local_38.data_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                          (local_58,"*Lexer(\"0\"sv).takeI32()","0u",(uint *)&gtest_ar_.message_,
                           (uint *)&local_38);
                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset(&local_1f00);
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_b0);
                  if (gtest_ar_._0_8_ == 0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = *(char **)gtest_ar_._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x105,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if ((long *)local_b0.pos != (long *)0x0) {
                    (**(code **)(*(long *)local_b0.pos + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar_);
                local_1ed8._M_engaged = false;
                buffer_10._M_str = "0";
                buffer_10._M_len = 1;
                ::wasm::WATParser::Lexer::Lexer
                          (&local_b0,buffer_10,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1ed8);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )::wasm::WATParser::Lexer::takeF64();
                local_38.data_ = (AssertHelperData *)0x0;
                testing::internal::CmpHelperEQ<double,double>
                          (local_58,"*Lexer(\"0\"sv).takeF64()","0.0",(double *)&gtest_ar_.message_,
                           (double *)&local_38);
                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset(&local_1ed8);
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_b0);
                  if (gtest_ar_._0_8_ == 0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = *(char **)gtest_ar_._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x106,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if ((long *)local_b0.pos != (long *)0x0) {
                    (**(code **)(*(long *)local_b0.pos + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar_);
                local_1eb0._M_engaged = false;
                buffer_11._M_str = "0";
                buffer_11._M_len = 1;
                ::wasm::WATParser::Lexer::Lexer
                          (&local_b0,buffer_11,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1eb0);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )::wasm::WATParser::Lexer::takeF32();
                local_38.data_ = (AssertHelperData *)0x0;
                testing::internal::CmpHelperEQ<float,double>
                          (local_58,"*Lexer(\"0\"sv).takeF32()","0.0",(float *)&gtest_ar_.message_,
                           (double *)&local_38);
                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset(&local_1eb0);
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_b0);
                  if (gtest_ar_._0_8_ == 0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = *(char **)gtest_ar_._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x107,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if ((long *)local_b0.pos != (long *)0x0) {
                    (**(code **)(*(long *)local_b0.pos + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar_);
                local_1e88._M_engaged = false;
                buffer_12._M_str = "0";
                buffer_12._M_len = 1;
                ::wasm::WATParser::Lexer::Lexer
                          (&local_b0,buffer_12,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1e88);
                lVar6 = ::wasm::WATParser::Lexer::takeF64();
                local_58[0] = (internal)(-1 < lVar6);
                gtest_ar_.success_ = false;
                gtest_ar_._1_7_ = 0;
                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset(&local_1e88);
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&gtest_ar_.message_);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&local_b0,local_58,
                             (AssertionResult *)"std::signbit(*Lexer(\"0\"sv).takeF64())","true",
                             "false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_38,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x108,(char *)local_b0.pos);
                  testing::internal::AssertHelper::operator=
                            (&local_38,(Message *)&gtest_ar_.message_);
                  testing::internal::AssertHelper::~AssertHelper(&local_38);
                  std::__cxx11::string::~string((string *)&local_b0);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar_);
                local_1e60._M_engaged = false;
                buffer_13._M_str = "0";
                buffer_13._M_len = 1;
                ::wasm::WATParser::Lexer::Lexer
                          (&local_b0,buffer_13,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1e60);
                iVar2 = ::wasm::WATParser::Lexer::takeF32();
                local_58[0] = (internal)(-1 < iVar2);
                gtest_ar_.success_ = false;
                gtest_ar_._1_7_ = 0;
                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset(&local_1e60);
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&gtest_ar_.message_);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&local_b0,local_58,
                             (AssertionResult *)"std::signbit(*Lexer(\"0\"sv).takeF32())","true",
                             "false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_38,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x109,(char *)local_b0.pos);
                  testing::internal::AssertHelper::operator=
                            (&local_38,(Message *)&gtest_ar_.message_);
                  testing::internal::AssertHelper::~AssertHelper(&local_38);
                  std::__cxx11::string::~string((string *)&local_b0);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar_);
                local_1e38._M_engaged = false;
                buffer_14._M_str = "+0";
                buffer_14._M_len = 2;
                ::wasm::WATParser::Lexer::Lexer
                          (&local_b0,buffer_14,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1e38);
                local_58[0] = (internal)(local_b0.pos != local_b0.buffer._M_len);
                gtest_ar_.success_ = false;
                gtest_ar_._1_7_ = 0;
                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset(&local_1e38);
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&gtest_ar_.message_);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&local_b0,local_58,
                             (AssertionResult *)"Lexer(\"+0\"sv).empty()","true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_38,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x10b,(char *)local_b0.pos);
                  testing::internal::AssertHelper::operator=
                            (&local_38,(Message *)&gtest_ar_.message_);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&gtest_ar_);
                  local_1e10._M_engaged = false;
                  buffer_15._M_str = "+0";
                  buffer_15._M_len = 2;
                  ::wasm::WATParser::Lexer::Lexer
                            (&local_b0,buffer_15,
                             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_1e10);
                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                  local_58[0] = (internal)(~extraout_DL_01 & 1);
                  gtest_ar_.success_ = false;
                  gtest_ar_._1_7_ = 0;
                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                  std::
                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::_M_reset(&local_1e10);
                  if (local_58[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&gtest_ar_.message_);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&local_b0,local_58,
                               (AssertionResult *)"Lexer(\"+0\"sv).takeU64()","true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_38,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x10c,(char *)local_b0.pos);
                    testing::internal::AssertHelper::operator=
                              (&local_38,(Message *)&gtest_ar_.message_);
                    testing::internal::AssertHelper::~AssertHelper(&local_38);
                    std::__cxx11::string::~string((string *)&local_b0);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&gtest_ar_);
                  local_1de8._M_engaged = false;
                  buffer_16._M_str = "+0";
                  buffer_16._M_len = 2;
                  ::wasm::WATParser::Lexer::Lexer
                            (&local_b0,buffer_16,
                             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_1de8);
                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                  gtest_ar_.success_ = false;
                  gtest_ar_._1_7_ = 0;
                  local_58[0] = extraout_DL_02;
                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                  std::
                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::_M_reset(&local_1de8);
                  if (local_58[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&gtest_ar_.message_);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&local_b0,local_58,(AssertionResult *)0x258c3f,"false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_38,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x10d,(char *)local_b0.pos);
                    testing::internal::AssertHelper::operator=
                              (&local_38,(Message *)&gtest_ar_.message_);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&gtest_ar_);
                    local_1dc0._M_engaged = false;
                    buffer_17._M_str = "+0";
                    buffer_17._M_len = 2;
                    ::wasm::WATParser::Lexer::Lexer
                              (&local_b0,buffer_17,
                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_1dc0);
                    uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
                    local_58[0] = (internal)((uVar4 >> 0x20 & 1) == 0);
                    gtest_ar_.success_ = false;
                    gtest_ar_._1_7_ = 0;
                    ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                    std::
                    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::_M_reset(&local_1dc0);
                    if (local_58[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&gtest_ar_.message_);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&local_b0,local_58,
                                 (AssertionResult *)"Lexer(\"+0\"sv).takeU32()","true","false",in_R9
                                );
                      testing::internal::AssertHelper::AssertHelper
                                (&local_38,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x10e,(char *)local_b0.pos);
                      testing::internal::AssertHelper::operator=
                                (&local_38,(Message *)&gtest_ar_.message_);
                      testing::internal::AssertHelper::~AssertHelper(&local_38);
                      std::__cxx11::string::~string((string *)&local_b0);
                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl !=
                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0) {
                        (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl + 8))();
                      }
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&gtest_ar_);
                    local_1d98._M_engaged = false;
                    buffer_18._M_str = "+0";
                    buffer_18._M_len = 2;
                    ::wasm::WATParser::Lexer::Lexer
                              (&local_b0,buffer_18,
                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_1d98);
                    ::wasm::WATParser::Lexer::takeI<unsigned_int>();
                    gtest_ar_.success_ = false;
                    gtest_ar_._1_7_ = 0;
                    local_58[0] = extraout_var_03;
                    ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                    std::
                    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::_M_reset(&local_1d98);
                    if (local_58[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&gtest_ar_.message_);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&local_b0,local_58,(AssertionResult *)0x258c58,"false",
                                 "true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_38,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x10f,(char *)local_b0.pos);
                      testing::internal::AssertHelper::operator=
                                (&local_38,(Message *)&gtest_ar_.message_);
                    }
                    else {
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&gtest_ar_);
                      local_1d70._M_engaged = false;
                      buffer_19._M_str = "+0";
                      buffer_19._M_len = 2;
                      ::wasm::WATParser::Lexer::Lexer
                                (&local_b0,buffer_19,
                                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_1d70);
                      local_58[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                      gtest_ar_.success_ = false;
                      gtest_ar_._1_7_ = 0;
                      ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                      std::
                      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::_M_reset(&local_1d70);
                      if (local_58[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&gtest_ar_.message_);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&local_b0,local_58,(AssertionResult *)0x258c71,"false",
                                   "true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_38,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x110,(char *)local_b0.pos);
                        testing::internal::AssertHelper::operator=
                                  (&local_38,(Message *)&gtest_ar_.message_);
                      }
                      else {
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&gtest_ar_);
                        local_1d48._M_engaged = false;
                        buffer_20._M_str = "+0";
                        buffer_20._M_len = 2;
                        ::wasm::WATParser::Lexer::Lexer
                                  (&local_b0,buffer_20,
                                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_1d48);
                        ::wasm::WATParser::Lexer::takeF32();
                        gtest_ar_.success_ = false;
                        gtest_ar_._1_7_ = 0;
                        local_58[0] = extraout_var_04;
                        ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                        std::
                        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::_M_reset(&local_1d48);
                        if (local_58[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&gtest_ar_.message_);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&local_b0,local_58,(AssertionResult *)0x258c8a,
                                     "false","true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_38,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x111,(char *)local_b0.pos);
                          testing::internal::AssertHelper::operator=
                                    (&local_38,(Message *)&gtest_ar_.message_);
                        }
                        else {
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&gtest_ar_);
                          local_1d20._M_engaged = false;
                          buffer_21._M_str = "+0";
                          buffer_21._M_len = 2;
                          ::wasm::WATParser::Lexer::Lexer
                                    (&local_b0,buffer_21,
                                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_1d20);
                          gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                          local_38.data_ = (AssertHelperData *)0x0;
                          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long_long>
                                    (local_58,"*Lexer(\"+0\"sv).takeI64()","0ull",
                                     (unsigned_long *)&gtest_ar_.message_,
                                     (unsigned_long_long *)&local_38);
                          ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                          std::
                          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::_M_reset(&local_1d20);
                          if (local_58[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_b0);
                            if (gtest_ar_._0_8_ == 0) {
                              pcVar5 = "";
                            }
                            else {
                              pcVar5 = *(char **)gtest_ar_._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x112,pcVar5);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_b0);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_);
                            if ((long *)local_b0.pos != (long *)0x0) {
                              (**(code **)(*(long *)local_b0.pos + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&gtest_ar_);
                          local_1cf8._M_engaged = false;
                          buffer_22._M_str = "+0";
                          buffer_22._M_len = 2;
                          ::wasm::WATParser::Lexer::Lexer
                                    (&local_b0,buffer_22,
                                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_1cf8);
                          gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )::wasm::WATParser::Lexer::takeI<unsigned_int>();
                          local_38.data_ = local_38.data_ & 0xffffffff00000000;
                          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                                    (local_58,"*Lexer(\"+0\"sv).takeI32()","0u",
                                     (uint *)&gtest_ar_.message_,(uint *)&local_38);
                          ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                          std::
                          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::_M_reset(&local_1cf8);
                          if (local_58[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_b0);
                            if (gtest_ar_._0_8_ == 0) {
                              pcVar5 = "";
                            }
                            else {
                              pcVar5 = *(char **)gtest_ar_._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x113,pcVar5);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_b0);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_);
                            if ((long *)local_b0.pos != (long *)0x0) {
                              (**(code **)(*(long *)local_b0.pos + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&gtest_ar_);
                          local_1cd0._M_engaged = false;
                          buffer_23._M_str = "+0";
                          buffer_23._M_len = 2;
                          ::wasm::WATParser::Lexer::Lexer
                                    (&local_b0,buffer_23,
                                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_1cd0);
                          gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )::wasm::WATParser::Lexer::takeF64();
                          local_38.data_ = (AssertHelperData *)0x0;
                          testing::internal::CmpHelperEQ<double,double>
                                    (local_58,"*Lexer(\"+0\"sv).takeF64()","0.0",
                                     (double *)&gtest_ar_.message_,(double *)&local_38);
                          ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                          std::
                          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::_M_reset(&local_1cd0);
                          if (local_58[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_b0);
                            if (gtest_ar_._0_8_ == 0) {
                              pcVar5 = "";
                            }
                            else {
                              pcVar5 = *(char **)gtest_ar_._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x114,pcVar5);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_b0);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_);
                            if ((long *)local_b0.pos != (long *)0x0) {
                              (**(code **)(*(long *)local_b0.pos + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&gtest_ar_);
                          local_1ca8._M_engaged = false;
                          buffer_24._M_str = "+0";
                          buffer_24._M_len = 2;
                          ::wasm::WATParser::Lexer::Lexer
                                    (&local_b0,buffer_24,
                                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_1ca8);
                          gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )::wasm::WATParser::Lexer::takeF32();
                          local_38.data_ = (AssertHelperData *)0x0;
                          testing::internal::CmpHelperEQ<float,double>
                                    (local_58,"*Lexer(\"+0\"sv).takeF32()","0.0",
                                     (float *)&gtest_ar_.message_,(double *)&local_38);
                          ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                          std::
                          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::_M_reset(&local_1ca8);
                          if (local_58[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_b0);
                            if (gtest_ar_._0_8_ == 0) {
                              pcVar5 = "";
                            }
                            else {
                              pcVar5 = *(char **)gtest_ar_._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x115,pcVar5);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_b0);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_);
                            if ((long *)local_b0.pos != (long *)0x0) {
                              (**(code **)(*(long *)local_b0.pos + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&gtest_ar_);
                          local_1c80._M_engaged = false;
                          buffer_25._M_str = "+0";
                          buffer_25._M_len = 2;
                          ::wasm::WATParser::Lexer::Lexer
                                    (&local_b0,buffer_25,
                                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_1c80);
                          lVar6 = ::wasm::WATParser::Lexer::takeF64();
                          local_58[0] = (internal)(-1 < lVar6);
                          gtest_ar_.success_ = false;
                          gtest_ar_._1_7_ = 0;
                          ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                          std::
                          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::_M_reset(&local_1c80);
                          if (local_58[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&gtest_ar_.message_);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&local_b0,local_58,
                                       (AssertionResult *)"std::signbit(*Lexer(\"+0\"sv).takeF64())"
                                       ,"true","false",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_38,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x116,(char *)local_b0.pos);
                            testing::internal::AssertHelper::operator=
                                      (&local_38,(Message *)&gtest_ar_.message_);
                            testing::internal::AssertHelper::~AssertHelper(&local_38);
                            std::__cxx11::string::~string((string *)&local_b0);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl !=
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&gtest_ar_);
                          local_1c58._M_engaged = false;
                          buffer_26._M_str = "+0";
                          buffer_26._M_len = 2;
                          ::wasm::WATParser::Lexer::Lexer
                                    (&local_b0,buffer_26,
                                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_1c58);
                          iVar2 = ::wasm::WATParser::Lexer::takeF32();
                          local_58[0] = (internal)(-1 < iVar2);
                          gtest_ar_.success_ = false;
                          gtest_ar_._1_7_ = 0;
                          ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                          std::
                          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::_M_reset(&local_1c58);
                          if (local_58[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&gtest_ar_.message_);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&local_b0,local_58,
                                       (AssertionResult *)"std::signbit(*Lexer(\"+0\"sv).takeF32())"
                                       ,"true","false",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_38,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x117,(char *)local_b0.pos);
                            testing::internal::AssertHelper::operator=
                                      (&local_38,(Message *)&gtest_ar_.message_);
                            testing::internal::AssertHelper::~AssertHelper(&local_38);
                            std::__cxx11::string::~string((string *)&local_b0);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl !=
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                            }
                          }
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&gtest_ar_);
                          local_1c30._M_engaged = false;
                          buffer_27._M_str = "-0";
                          buffer_27._M_len = 2;
                          ::wasm::WATParser::Lexer::Lexer
                                    (&local_b0,buffer_27,
                                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_1c30);
                          local_58[0] = (internal)(local_b0.pos != local_b0.buffer._M_len);
                          gtest_ar_.success_ = false;
                          gtest_ar_._1_7_ = 0;
                          ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                          std::
                          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::_M_reset(&local_1c30);
                          if (local_58[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&gtest_ar_.message_);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&local_b0,local_58,
                                       (AssertionResult *)"Lexer(\"-0\"sv).empty()","true","false",
                                       in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_38,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x119,(char *)local_b0.pos);
                            testing::internal::AssertHelper::operator=
                                      (&local_38,(Message *)&gtest_ar_.message_);
                          }
                          else {
                            std::
                            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&gtest_ar_);
                            local_1c08._M_engaged = false;
                            buffer_28._M_str = "-0";
                            buffer_28._M_len = 2;
                            ::wasm::WATParser::Lexer::Lexer
                                      (&local_b0,buffer_28,
                                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_1c08);
                            ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                            local_58[0] = (internal)(~extraout_DL_03 & 1);
                            gtest_ar_.success_ = false;
                            gtest_ar_._1_7_ = 0;
                            ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset(&local_1c08);
                            if (local_58[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&gtest_ar_.message_);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&local_b0,local_58,
                                         (AssertionResult *)"Lexer(\"-0\"sv).takeU64()","true",
                                         "false",in_R9);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_38,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x11a,(char *)local_b0.pos);
                              testing::internal::AssertHelper::operator=
                                        (&local_38,(Message *)&gtest_ar_.message_);
                              testing::internal::AssertHelper::~AssertHelper(&local_38);
                              std::__cxx11::string::~string((string *)&local_b0);
                              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl !=
                                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )0x0) {
                                (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                              }
                            }
                            std::
                            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&gtest_ar_);
                            local_1be0._M_engaged = false;
                            buffer_29._M_str = "-0";
                            buffer_29._M_len = 2;
                            ::wasm::WATParser::Lexer::Lexer
                                      (&local_b0,buffer_29,
                                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_1be0);
                            ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                            gtest_ar_.success_ = false;
                            gtest_ar_._1_7_ = 0;
                            local_58[0] = extraout_DL_04;
                            ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset(&local_1be0);
                            if (local_58[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&gtest_ar_.message_);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&local_b0,local_58,(AssertionResult *)0x258d37,
                                         "false","true",in_R9);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_38,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x11b,(char *)local_b0.pos);
                              testing::internal::AssertHelper::operator=
                                        (&local_38,(Message *)&gtest_ar_.message_);
                            }
                            else {
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_1bb8._M_engaged = false;
                              buffer_30._M_str = "-0";
                              buffer_30._M_len = 2;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_b0,buffer_30,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_1bb8);
                              uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
                              local_58[0] = (internal)((uVar4 & 0x100000000) == 0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_1bb8);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_b0,local_58,
                                           (AssertionResult *)"Lexer(\"-0\"sv).takeU32()","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_38,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x11c,(char *)local_b0.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_38,(Message *)&gtest_ar_.message_);
                                testing::internal::AssertHelper::~AssertHelper(&local_38);
                                std::__cxx11::string::~string((string *)&local_b0);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl !=
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                              }
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar_);
                              local_1b90._M_engaged = false;
                              buffer_31._M_str = "-0";
                              buffer_31._M_len = 2;
                              ::wasm::WATParser::Lexer::Lexer
                                        (&local_b0,buffer_31,
                                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_1b90);
                              ::wasm::WATParser::Lexer::takeI<unsigned_int>();
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              local_58[0] = extraout_var_05;
                              ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset(&local_1b90);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&local_b0,local_58,(AssertionResult *)0x258d50,
                                           "false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_38,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x11d,(char *)local_b0.pos);
                                testing::internal::AssertHelper::operator=
                                          (&local_38,(Message *)&gtest_ar_.message_);
                              }
                              else {
                                std::
                                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&gtest_ar_);
                                local_1b68._M_engaged = false;
                                buffer_32._M_str = "-0";
                                buffer_32._M_len = 2;
                                ::wasm::WATParser::Lexer::Lexer
                                          (&local_b0,buffer_32,
                                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_1b68);
                                local_58[0] = (internal)::wasm::WATParser::Lexer::takeF64();
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                std::
                                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::_M_reset(&local_1b68);
                                if (local_58[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&gtest_ar_.message_);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&local_b0,local_58,
                                             (AssertionResult *)0x258d69,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_38,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x11e,(char *)local_b0.pos);
                                  testing::internal::AssertHelper::operator=
                                            (&local_38,(Message *)&gtest_ar_.message_);
                                }
                                else {
                                  std::
                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&gtest_ar_);
                                  local_1b40._M_engaged = false;
                                  buffer_33._M_str = "-0";
                                  buffer_33._M_len = 2;
                                  ::wasm::WATParser::Lexer::Lexer
                                            (&local_b0,buffer_33,
                                             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_1b40);
                                  ::wasm::WATParser::Lexer::takeF32();
                                  gtest_ar_.success_ = false;
                                  gtest_ar_._1_7_ = 0;
                                  local_58[0] = extraout_var_06;
                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                  std::
                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::_M_reset(&local_1b40);
                                  if (local_58[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)&gtest_ar_.message_);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&local_b0,local_58,
                                               (AssertionResult *)0x258d87,"false","true",in_R9);
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_38,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                               ,0x11f,(char *)local_b0.pos);
                                    testing::internal::AssertHelper::operator=
                                              (&local_38,(Message *)&gtest_ar_.message_);
                                  }
                                  else {
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                    local_1b18._M_engaged = false;
                                    buffer_34._M_str = "-0";
                                    buffer_34._M_len = 2;
                                    ::wasm::WATParser::Lexer::Lexer
                                              (&local_b0,buffer_34,
                                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_1b18);
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                    local_38.data_ = (AssertHelperData *)0x0;
                                    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long_long>
                                              (local_58,"*Lexer(\"-0\"sv).takeI64()","0ull",
                                               (unsigned_long *)&gtest_ar_.message_,
                                               (unsigned_long_long *)&local_38);
                                    ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                    std::
                                    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::_M_reset(&local_1b18);
                                    if (local_58[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&local_b0);
                                      if (gtest_ar_._0_8_ == 0) {
                                        pcVar5 = "";
                                      }
                                      else {
                                        pcVar5 = *(char **)gtest_ar_._0_8_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                 ,0x120,pcVar5);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_.message_,
                                                 (Message *)&local_b0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_.message_);
                                      if ((long *)local_b0.pos != (long *)0x0) {
                                        (**(code **)(*(long *)local_b0.pos + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                    local_1af0._M_engaged = false;
                                    buffer_35._M_str = "-0";
                                    buffer_35._M_len = 2;
                                    ::wasm::WATParser::Lexer::Lexer
                                              (&local_b0,buffer_35,
                                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_1af0);
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                    local_38.data_ = local_38.data_ & 0xffffffff00000000;
                                    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                                              (local_58,"*Lexer(\"-0\"sv).takeI32()","0u",
                                               (uint *)&gtest_ar_.message_,(uint *)&local_38);
                                    ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                    std::
                                    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::_M_reset(&local_1af0);
                                    if (local_58[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&local_b0);
                                      if (gtest_ar_._0_8_ == 0) {
                                        pcVar5 = "";
                                      }
                                      else {
                                        pcVar5 = *(char **)gtest_ar_._0_8_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                 ,0x121,pcVar5);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_.message_,
                                                 (Message *)&local_b0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_.message_);
                                      if ((long *)local_b0.pos != (long *)0x0) {
                                        (**(code **)(*(long *)local_b0.pos + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                    local_1ac8._M_engaged = false;
                                    buffer_36._M_str = "-0";
                                    buffer_36._M_len = 2;
                                    ::wasm::WATParser::Lexer::Lexer
                                              (&local_b0,buffer_36,
                                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_1ac8);
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )::wasm::WATParser::Lexer::takeF64();
                                    local_38.data_ = (AssertHelperData *)&DAT_8000000000000000;
                                    testing::internal::CmpHelperEQ<double,double>
                                              (local_58,"*Lexer(\"-0\"sv).takeF64()","-0.0",
                                               (double *)&gtest_ar_.message_,(double *)&local_38);
                                    ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                    std::
                                    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::_M_reset(&local_1ac8);
                                    if (local_58[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&local_b0);
                                      if (gtest_ar_._0_8_ == 0) {
                                        pcVar5 = "";
                                      }
                                      else {
                                        pcVar5 = *(char **)gtest_ar_._0_8_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                 ,0x122,pcVar5);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_.message_,
                                                 (Message *)&local_b0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_.message_);
                                      if ((long *)local_b0.pos != (long *)0x0) {
                                        (**(code **)(*(long *)local_b0.pos + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                    local_1aa0._M_engaged = false;
                                    buffer_37._M_str = "-0";
                                    buffer_37._M_len = 2;
                                    ::wasm::WATParser::Lexer::Lexer
                                              (&local_b0,buffer_37,
                                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_1aa0);
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )::wasm::WATParser::Lexer::takeF32();
                                    local_38.data_ = (AssertHelperData *)&DAT_8000000000000000;
                                    testing::internal::CmpHelperEQ<float,double>
                                              (local_58,"*Lexer(\"-0\"sv).takeF32()","-0.0",
                                               (float *)&gtest_ar_.message_,(double *)&local_38);
                                    ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                    std::
                                    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::_M_reset(&local_1aa0);
                                    if (local_58[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&local_b0);
                                      if (gtest_ar_._0_8_ == 0) {
                                        pcVar5 = "";
                                      }
                                      else {
                                        pcVar5 = *(char **)gtest_ar_._0_8_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                 ,0x123,pcVar5);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_.message_,
                                                 (Message *)&local_b0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_.message_);
                                      if ((long *)local_b0.pos != (long *)0x0) {
                                        (**(code **)(*(long *)local_b0.pos + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                    local_1a78._M_engaged = false;
                                    buffer_38._M_str = "-0";
                                    buffer_38._M_len = 2;
                                    ::wasm::WATParser::Lexer::Lexer
                                              (&local_b0,buffer_38,
                                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_1a78);
                                    uVar3 = ::wasm::WATParser::Lexer::takeF64();
                                    auVar1._8_8_ = extraout_XMM0_Qb;
                                    auVar1._0_8_ = extraout_XMM0_Qa;
                                    uVar3 = movmskpd(uVar3,auVar1);
                                    local_58[0] = (internal)((byte)uVar3 & 1);
                                    gtest_ar_.success_ = false;
                                    gtest_ar_._1_7_ = 0;
                                    ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                    std::
                                    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::_M_reset(&local_1a78);
                                    if (local_58[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&gtest_ar_.message_);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)&local_b0,local_58,
                                                 (AssertionResult *)
                                                 "std::signbit(*Lexer(\"-0\"sv).takeF64())","false",
                                                 "true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_38,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                 ,0x124,(char *)local_b0.pos);
                                      testing::internal::AssertHelper::operator=
                                                (&local_38,(Message *)&gtest_ar_.message_);
                                    }
                                    else {
                                      std::
                                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                      local_1a50._M_engaged = false;
                                      buffer_39._M_str = "-0";
                                      buffer_39._M_len = 2;
                                      ::wasm::WATParser::Lexer::Lexer
                                                (&local_b0,buffer_39,
                                                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1a50);
                                      ::wasm::WATParser::Lexer::takeF32();
                                      local_58[0] = (internal)(extraout_var >> 7);
                                      gtest_ar_.success_ = false;
                                      gtest_ar_._1_7_ = 0;
                                      ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                      std::
                                      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::_M_reset(&local_1a50);
                                      if (local_58[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)&gtest_ar_.message_);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  ((string *)&local_b0,local_58,
                                                   (AssertionResult *)
                                                   "std::signbit(*Lexer(\"-0\"sv).takeF32())",
                                                   "false","true",in_R9);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_38,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x125,(char *)local_b0.pos);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_38,(Message *)&gtest_ar_.message_);
                                      }
                                      else {
                                        std::
                                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                        local_1a28._M_engaged = false;
                                        buffer_40._M_str = "0x7fff_ffff";
                                        buffer_40._M_len = 0xb;
                                        ::wasm::WATParser::Lexer::Lexer
                                                  (&local_b0,buffer_40,
                                                   (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1a28);
                                        local_58[0] = (internal)
                                                      (local_b0.pos != local_b0.buffer._M_len);
                                        gtest_ar_.success_ = false;
                                        gtest_ar_._1_7_ = 0;
                                        ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                        std::
                                        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::_M_reset(&local_1a28);
                                        if (local_58[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)&gtest_ar_.message_);
                                          testing::internal::
                                          GetBoolAssertionFailureMessage_abi_cxx11_
                                                    ((string *)&local_b0,local_58,
                                                     (AssertionResult *)
                                                     "Lexer(\"0x7fff_ffff\"sv).empty()","true",
                                                     "false",in_R9);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_38,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x127,(char *)local_b0.pos);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_38,(Message *)&gtest_ar_.message_);
                                        }
                                        else {
                                          std::
                                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                          local_1a00._M_engaged = false;
                                          buffer_41._M_str = "0x7fff_ffff";
                                          buffer_41._M_len = 0xb;
                                          ::wasm::WATParser::Lexer::Lexer
                                                    (&local_b0,buffer_41,
                                                     (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1a00);
                                          ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                          gtest_ar_.success_ = false;
                                          gtest_ar_._1_7_ = 0;
                                          local_58[0] = extraout_DL_05;
                                          ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                          std::
                                          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::_M_reset(&local_1a00);
                                          if (local_58[0] == (internal)0x0) {
                                            testing::Message::Message
                                                      ((Message *)&gtest_ar_.message_);
                                            testing::internal::
                                            GetBoolAssertionFailureMessage_abi_cxx11_
                                                      ((string *)&local_b0,local_58,
                                                       (AssertionResult *)0x258e0d,"false","true",
                                                       in_R9);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_38,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x128,(char *)local_b0.pos);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_38,(Message *)&gtest_ar_.message_);
                                          }
                                          else {
                                            std::
                                            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                            local_19d8._M_engaged = false;
                                            buffer_42._M_str = "0x7fff_ffff";
                                            buffer_42._M_len = 0xb;
                                            ::wasm::WATParser::Lexer::Lexer
                                                      (&local_b0,buffer_42,
                                                       (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_19d8);
                                            ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                            gtest_ar_.success_ = false;
                                            gtest_ar_._1_7_ = 0;
                                            local_58[0] = extraout_DL_06;
                                            ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                            std::
                                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::_M_reset(&local_19d8);
                                            if (local_58[0] == (internal)0x0) {
                                              testing::Message::Message
                                                        ((Message *)&gtest_ar_.message_);
                                              testing::internal::
                                              GetBoolAssertionFailureMessage_abi_cxx11_
                                                        ((string *)&local_b0,local_58,
                                                         (AssertionResult *)0x258e3d,"false","true",
                                                         in_R9);
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_38,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x129,(char *)local_b0.pos);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_38,(Message *)&gtest_ar_.message_);
                                            }
                                            else {
                                              std::
                                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                              local_19b0._M_engaged = false;
                                              buffer_43._M_str = "0x7fff_ffff";
                                              buffer_43._M_len = 0xb;
                                              ::wasm::WATParser::Lexer::Lexer
                                                        (&local_b0,buffer_43,
                                                         (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_19b0);
                                              ::wasm::WATParser::Lexer::takeU<unsigned_int>();
                                              gtest_ar_.success_ = false;
                                              gtest_ar_._1_7_ = 0;
                                              local_58[0] = extraout_var_07;
                                              ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                              std::
                                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::_M_reset(&local_19b0);
                                              if (local_58[0] == (internal)0x0) {
                                                testing::Message::Message
                                                          ((Message *)&gtest_ar_.message_);
                                                testing::internal::
                                                GetBoolAssertionFailureMessage_abi_cxx11_
                                                          ((string *)&local_b0,local_58,
                                                           (AssertionResult *)0x258e5f,"false",
                                                           "true",in_R9);
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_38,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x12a,(char *)local_b0.pos);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_38,(Message *)&gtest_ar_.message_)
                                                ;
                                              }
                                              else {
                                                std::
                                                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                local_1988._M_engaged = false;
                                                buffer_44._M_str = "0x7fff_ffff";
                                                buffer_44._M_len = 0xb;
                                                ::wasm::WATParser::Lexer::Lexer
                                                          (&local_b0,buffer_44,
                                                           (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1988);
                                                ::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                                gtest_ar_.success_ = false;
                                                gtest_ar_._1_7_ = 0;
                                                local_58[0] = extraout_var_08;
                                                ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                std::
                                                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::_M_reset(&local_1988);
                                                if (local_58[0] == (internal)0x0) {
                                                  testing::Message::Message
                                                            ((Message *)&gtest_ar_.message_);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&local_b0,local_58,
                                                             (AssertionResult *)0x258e8d,"false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,299,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                }
                                                else {
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1960._M_engaged = false;
                                                  buffer_45._M_str = "0x7fff_ffff";
                                                  buffer_45._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_45,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1960);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1960);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x258eaf,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,300,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1938._M_engaged = false;
                                                  buffer_46._M_str = "0x7fff_ffff";
                                                  buffer_46._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_46,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1938);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_09;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1938);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x258edf,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x12d,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1910._M_engaged = false;
                                                  buffer_47._M_str = "0x7fff_ffff";
                                                  buffer_47._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_47,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1910);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_38.data_ = (AssertHelperData *)0x7fffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0x7fff_ffff\"sv).takeU64()",
                                                  "0x7fffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1910);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x12e,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_18e8._M_engaged = false;
                                                  buffer_48._M_str = "0x7fff_ffff";
                                                  buffer_48._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_48,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_18e8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ = (AssertHelperData *)0x7fffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0x7fff_ffff\"sv).takeI64()",
                                                  "0x7fffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_18e8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x12f,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_18c0._M_engaged = false;
                                                  buffer_49._M_str = "0x7fff_ffff";
                                                  buffer_49._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_49,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_18c0);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeU<unsigned_int>();
                                                  local_38.data_._0_4_ = 0x7fffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_int,unsigned_int>
                                                            (local_58,
                                                  "*Lexer(\"0x7fff_ffff\"sv).takeU32()",
                                                  "0x7fffffffu",(uint *)&gtest_ar_.message_,
                                                  (uint *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_18c0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x130,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1898._M_engaged = false;
                                                  buffer_50._M_str = "0x7fff_ffff";
                                                  buffer_50._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_50,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1898);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                                  local_38.data_._0_4_ = 0x7fffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_int,unsigned_int>
                                                            (local_58,
                                                  "*Lexer(\"0x7fff_ffff\"sv).takeI32()",
                                                  "0x7fffffffu",(uint *)&gtest_ar_.message_,
                                                  (uint *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1898);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x131,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1870._M_engaged = false;
                                                  buffer_51._M_str = "0x7fff_ffff";
                                                  buffer_51._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_51,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1870);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x41dfffffffc00000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"0x7fff_ffff\"sv).takeF64()",
                                                  "0x7fffffff.p0",(double *)&gtest_ar_.message_,
                                                  (double *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1870);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x132,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1848._M_engaged = false;
                                                  buffer_52._M_str = "0x7fff_ffff";
                                                  buffer_52._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_52,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1848);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x4f000000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"0x7fff_ffff\"sv).takeF32()",
                                                  "0x7fffffff.p0f",(float *)&gtest_ar_.message_,
                                                  (float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1848);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x133,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1820._M_engaged = false;
                                                  buffer_53._M_str = "0x8000_0000";
                                                  buffer_53._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_53,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1820);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1820);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"0x8000_0000\"sv).empty()",
                                                               "true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x135,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_17f8._M_engaged = false;
                                                  buffer_54._M_str = "0x8000_0000";
                                                  buffer_54._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_54,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_17f8);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_07;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_17f8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x258f2f,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x136,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_17d0._M_engaged = false;
                                                  buffer_55._M_str = "0x8000_0000";
                                                  buffer_55._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_55,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_17d0);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_08;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_17d0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x258f51,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x137,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_17a8._M_engaged = false;
                                                  buffer_56._M_str = "0x8000_0000";
                                                  buffer_56._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_56,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_17a8);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_int>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_10;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_17a8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x258f73,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x138,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1780._M_engaged = false;
                                                  buffer_57._M_str = "0x8000_0000";
                                                  buffer_57._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_57,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1780);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_11;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1780);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x258f95,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x139,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1758._M_engaged = false;
                                                  buffer_58._M_str = "0x8000_0000";
                                                  buffer_58._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_58,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1758);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1758);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x258fb7,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x13a,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1730._M_engaged = false;
                                                  buffer_59._M_str = "0x8000_0000";
                                                  buffer_59._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_59,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1730);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_12;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1730);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x258fd9,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x13b,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1708._M_engaged = false;
                                                  buffer_60._M_str = "0x8000_0000";
                                                  buffer_60._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_60,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1708);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_38.data_ = (AssertHelperData *)0x80000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0x8000_0000\"sv).takeU64()",
                                                  "0x80000000ull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1708);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x13c,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_16e0._M_engaged = false;
                                                  buffer_61._M_str = "0x8000_0000";
                                                  buffer_61._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_61,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_16e0);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ = (AssertHelperData *)0x80000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0x8000_0000\"sv).takeI64()",
                                                  "0x80000000ull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_16e0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x13d,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_16b8._M_engaged = false;
                                                  buffer_62._M_str = "0x8000_0000";
                                                  buffer_62._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_62,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_16b8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeU<unsigned_int>();
                                                  local_38.data_._0_4_ = 0x80000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_int,unsigned_int>
                                                            (local_58,
                                                  "*Lexer(\"0x8000_0000\"sv).takeU32()",
                                                  "0x80000000u",(uint *)&gtest_ar_.message_,
                                                  (uint *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_16b8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x13e,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1690._M_engaged = false;
                                                  buffer_63._M_str = "0x8000_0000";
                                                  buffer_63._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_63,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1690);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                                  local_38.data_._0_4_ = 0x80000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_int,unsigned_int>
                                                            (local_58,
                                                  "*Lexer(\"0x8000_0000\"sv).takeI32()",
                                                  "0x80000000u",(uint *)&gtest_ar_.message_,
                                                  (uint *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1690);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x13f,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1668._M_engaged = false;
                                                  buffer_64._M_str = "0x8000_0000";
                                                  buffer_64._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_64,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1668);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x41e0000000000000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"0x8000_0000\"sv).takeF64()",
                                                  "0x80000000.p0",(double *)&gtest_ar_.message_,
                                                  (double *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1668);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x140,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1640._M_engaged = false;
                                                  buffer_65._M_str = "0x8000_0000";
                                                  buffer_65._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_65,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1640);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x4f000000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"0x8000_0000\"sv).takeF32()",
                                                  "0x80000000.p0f",(float *)&gtest_ar_.message_,
                                                  (float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1640);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x141,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1618._M_engaged = false;
                                                  buffer_66._M_str = "+0x7fff_ffff";
                                                  buffer_66._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_66,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1618);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1618);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0x7fff_ffff\"sv).empty()",
                                                               "true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x143,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_15f0._M_engaged = false;
                                                  buffer_67._M_str = "+0x7fff_ffff";
                                                  buffer_67._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_67,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_15f0);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_58[0] = (internal)(~extraout_DL_09 & 1);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_15f0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0x7fff_ffff\"sv).takeU64()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x144,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_15c8._M_engaged = false;
                                                  buffer_68._M_str = "+0x7fff_ffff";
                                                  buffer_68._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_68,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_15c8);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_10;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_15c8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x25906c,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x145,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_15a0._M_engaged = false;
                                                  buffer_69._M_str = "+0x7fff_ffff";
                                                  buffer_69._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_69,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_15a0);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_15a0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0x7fff_ffff\"sv).takeU32()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x146,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1578._M_engaged = false;
                                                  buffer_70._M_str = "+0x7fff_ffff";
                                                  buffer_70._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_70,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1578);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_13;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1578);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x25908f,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x147,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1550._M_engaged = false;
                                                  buffer_71._M_str = "+0x7fff_ffff";
                                                  buffer_71._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_71,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1550);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1550);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2590b2,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x148,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1528._M_engaged = false;
                                                  buffer_72._M_str = "+0x7fff_ffff";
                                                  buffer_72._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_72,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1528);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_14;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1528);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2590d5,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x149,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1500._M_engaged = false;
                                                  buffer_73._M_str = "+0x7fff_ffff";
                                                  buffer_73._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_73,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1500);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ = (AssertHelperData *)0x7fffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"+0x7fff_ffff\"sv).takeI64()",
                                                  "0x7fffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1500);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x14a,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_14d8._M_engaged = false;
                                                  buffer_74._M_str = "+0x7fff_ffff";
                                                  buffer_74._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_74,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_14d8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                                  local_38.data_._0_4_ = 0x7fffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_int,unsigned_int>
                                                            (local_58,
                                                  "*Lexer(\"+0x7fff_ffff\"sv).takeI32()",
                                                  "0x7fffffffu",(uint *)&gtest_ar_.message_,
                                                  (uint *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_14d8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x14b,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_14b0._M_engaged = false;
                                                  buffer_75._M_str = "+0x7fff_ffff";
                                                  buffer_75._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_75,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_14b0);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x41dfffffffc00000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"+0x7fff_ffff\"sv).takeF64()",
                                                  "0x7fffffff.p0",(double *)&gtest_ar_.message_,
                                                  (double *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_14b0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x14c,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1488._M_engaged = false;
                                                  buffer_76._M_str = "+0x7fff_ffff";
                                                  buffer_76._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_76,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1488);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x4f000000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"+0x7fff_ffff\"sv).takeF32()",
                                                  "0x7fffffff.p0f",(float *)&gtest_ar_.message_,
                                                  (float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1488);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x14d,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1460._M_engaged = false;
                                                  buffer_77._M_str = "+0x8000_0000";
                                                  buffer_77._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_77,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1460);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1460);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0x8000_0000\"sv).empty()",
                                                               "true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x14f,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1438._M_engaged = false;
                                                  buffer_78._M_str = "+0x8000_0000";
                                                  buffer_78._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_78,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1438);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_58[0] = (internal)(~extraout_DL_11 & 1);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1438);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0x8000_0000\"sv).takeU64()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x150,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1410._M_engaged = false;
                                                  buffer_79._M_str = "+0x8000_0000";
                                                  buffer_79._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_79,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1410);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_12;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1410);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x25918b,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x151,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_13e8._M_engaged = false;
                                                  buffer_80._M_str = "+0x8000_0000";
                                                  buffer_80._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_80,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_13e8);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_13e8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0x8000_0000\"sv).takeU32()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x152,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_13c0._M_engaged = false;
                                                  buffer_81._M_str = "+0x8000_0000";
                                                  buffer_81._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_81,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_13c0);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeI<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_13c0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0x8000_0000\"sv).takeI32()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x153,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1398._M_engaged = false;
                                                  buffer_82._M_str = "+0x8000_0000";
                                                  buffer_82._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_82,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1398);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1398);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2591ae,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x154,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1370._M_engaged = false;
                                                  buffer_83._M_str = "+0x8000_0000";
                                                  buffer_83._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_83,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1370);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_15;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1370);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2591d1,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x155,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1348._M_engaged = false;
                                                  buffer_84._M_str = "+0x8000_0000";
                                                  buffer_84._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_84,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1348);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ = (AssertHelperData *)0x80000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"+0x8000_0000\"sv).takeI64()",
                                                  "0x80000000ull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1348);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x156,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1320._M_engaged = false;
                                                  buffer_85._M_str = "+0x8000_0000";
                                                  buffer_85._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_85,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1320);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x41e0000000000000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"+0x8000_0000\"sv).takeF64()",
                                                  "0x80000000.p0",(double *)&gtest_ar_.message_,
                                                  (double *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1320);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x157,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_12f8._M_engaged = false;
                                                  buffer_86._M_str = "+0x8000_0000";
                                                  buffer_86._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_86,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_12f8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x4f000000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"+0x8000_0000\"sv).takeF32()",
                                                  "0x80000000.p0f",(float *)&gtest_ar_.message_,
                                                  (float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_12f8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x158,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_12d0._M_engaged = false;
                                                  buffer_87._M_str = "-0x8000_0000";
                                                  buffer_87._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_87,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_12d0);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_12d0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"-0x8000_0000\"sv).empty()",
                                                               "true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x15a,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_12a8._M_engaged = false;
                                                  buffer_88._M_str = "-0x8000_0000";
                                                  buffer_88._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_88,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_12a8);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_58[0] = (internal)(~extraout_DL_13 & 1);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_12a8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"-0x8000_0000\"sv).takeU64()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x15b,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1280._M_engaged = false;
                                                  buffer_89._M_str = "-0x8000_0000";
                                                  buffer_89._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_89,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1280);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_14;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1280);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259265,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x15c,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1258._M_engaged = false;
                                                  buffer_90._M_str = "-0x8000_0000";
                                                  buffer_90._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_90,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1258);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1258);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"-0x8000_0000\"sv).takeU32()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x15d,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1230._M_engaged = false;
                                                  buffer_91._M_str = "-0x8000_0000";
                                                  buffer_91._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_91,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1230);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_16;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1230);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259297,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x15e,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1208._M_engaged = false;
                                                  buffer_92._M_str = "-0x8000_0000";
                                                  buffer_92._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_92,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1208);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1208);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2592c7,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x15f,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_11e0._M_engaged = false;
                                                  buffer_93._M_str = "-0x8000_0000";
                                                  buffer_93._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_93,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_11e0);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_17;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_11e0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2592f9,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x160,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_11b8._M_engaged = false;
                                                  buffer_94._M_str = "-0x8000_0000";
                                                  buffer_94._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_94,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_11b8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0xffffffff80000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"-0x8000_0000\"sv).takeI64()",
                                                  "-0x80000000ull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_11b8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x161,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1190._M_engaged = false;
                                                  buffer_95._M_str = "-0x8000_0000";
                                                  buffer_95._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_95,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1190);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                                  local_38.data_._0_4_ = 0x80000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_int,unsigned_int>
                                                            (local_58,
                                                  "*Lexer(\"-0x8000_0000\"sv).takeI32()",
                                                  "-0x80000000u",(uint *)&gtest_ar_.message_,
                                                  (uint *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1190);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x162,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1168._M_engaged = false;
                                                  buffer_96._M_str = "-0x8000_0000";
                                                  buffer_96._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_96,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1168);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0xc1e0000000000000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"-0x8000_0000\"sv).takeF64()",
                                                  "-0x80000000.p0",(double *)&gtest_ar_.message_,
                                                  (double *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1168);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x163,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1140._M_engaged = false;
                                                  buffer_97._M_str = "-0x8000_0000";
                                                  buffer_97._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_97,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1140);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0xcf000000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"-0x8000_0000\"sv).takeF32()",
                                                  "-0x80000000.p0f",(float *)&gtest_ar_.message_,
                                                  (float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1140);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x164,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1118._M_engaged = false;
                                                  buffer_98._M_str = "-0x8000_0001";
                                                  buffer_98._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_98,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1118);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1118);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"-0x8000_0001\"sv).empty()",
                                                               "true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x166,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_10f0._M_engaged = false;
                                                  buffer_99._M_str = "-0x8000_0001";
                                                  buffer_99._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_99,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_10f0);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_58[0] = (internal)(~extraout_DL_15 & 1);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_10f0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"-0x8000_0001\"sv).takeU64()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x167,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_10c8._M_engaged = false;
                                                  buffer_x00100._M_str = "-0x8000_0001";
                                                  buffer_x00100._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00100,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_10c8);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_16;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_10c8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2593bf,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x168,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_10a0._M_engaged = false;
                                                  buffer_x00101._M_str = "-0x8000_0001";
                                                  buffer_x00101._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00101,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_10a0);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_10a0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"-0x8000_0001\"sv).takeU32()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x169,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1078._M_engaged = false;
                                                  buffer_x00102._M_str = "-0x8000_0001";
                                                  buffer_x00102._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00102,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1078);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeI<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1078);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"-0x8000_0001\"sv).takeI32()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x16a,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1050._M_engaged = false;
                                                  buffer_x00103._M_str = "-0x8000_0001";
                                                  buffer_x00103._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00103,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1050);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1050);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2593f1,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x16b,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1028._M_engaged = false;
                                                  buffer_x00104._M_str = "-0x8000_0001";
                                                  buffer_x00104._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00104,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1028);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_18;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1028);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259423,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x16c,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1000._M_engaged = false;
                                                  buffer_x00105._M_str = "-0x8000_0001";
                                                  buffer_x00105._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00105,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1000);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0xffffffff7fffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"-0x8000_0001\"sv).takeI64()",
                                                  "-0x80000001ull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1000);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x16d,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_fd8._M_engaged = false;
                                                  buffer_x00106._M_str = "-0x8000_0001";
                                                  buffer_x00106._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00106,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_fd8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0xc1e0000000200000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"-0x8000_0001\"sv).takeF64()",
                                                  "-0x80000001.p0",(double *)&gtest_ar_.message_,
                                                  (double *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_fd8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x16e,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_fb0._M_engaged = false;
                                                  buffer_x00107._M_str = "-0x8000_0001";
                                                  buffer_x00107._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00107,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_fb0);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0xcf000000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"-0x8000_0001\"sv).takeF32()",
                                                  "-0x80000001.p0f",(float *)&gtest_ar_.message_,
                                                  (float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_fb0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x16f,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_f88._M_engaged = false;
                                                  buffer_x00108._M_str = "0xffff_ffff";
                                                  buffer_x00108._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00108,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f88);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_f88);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"0xffff_ffff\"sv).empty()",
                                                               "true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x171,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_f60._M_engaged = false;
                                                  buffer_x00109._M_str = "0xffff_ffff";
                                                  buffer_x00109._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00109,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f60);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_17;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_f60);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259475,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x172,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_f38._M_engaged = false;
                                                  buffer_x00110._M_str = "0xffff_ffff";
                                                  buffer_x00110._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00110,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f38);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_18;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_f38);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2594a5,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x173,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_f10._M_engaged = false;
                                                  buffer_x00111._M_str = "0xffff_ffff";
                                                  buffer_x00111._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00111,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f10);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_int>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_19;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_f10);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2594c7,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x174,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_ee8._M_engaged = false;
                                                  buffer_x00112._M_str = "0xffff_ffff";
                                                  buffer_x00112._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00112,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_ee8);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_20;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_ee8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2594f5,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x175,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_ec0._M_engaged = false;
                                                  buffer_x00113._M_str = "0xffff_ffff";
                                                  buffer_x00113._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00113,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_ec0);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_ec0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259517,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x176,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_e98._M_engaged = false;
                                                  buffer_x00114._M_str = "0xffff_ffff";
                                                  buffer_x00114._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00114,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e98);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_21;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_e98);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259547,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x177,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_e70._M_engaged = false;
                                                  buffer_x00115._M_str = "0xffff_ffff";
                                                  buffer_x00115._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00115,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e70);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_38.data_ = (AssertHelperData *)0xffffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0xffff_ffff\"sv).takeU64()",
                                                  "0xffffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_e70);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x178,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_e48._M_engaged = false;
                                                  buffer_x00116._M_str = "0xffff_ffff";
                                                  buffer_x00116._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00116,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e48);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ = (AssertHelperData *)0xffffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0xffff_ffff\"sv).takeI64()",
                                                  "0xffffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_e48);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x179,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_e20._M_engaged = false;
                                                  buffer_x00117._M_str = "0xffff_ffff";
                                                  buffer_x00117._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00117,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e20);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeU<unsigned_int>();
                                                  local_38.data_._0_4_ = 0xffffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_int,unsigned_int>
                                                            (local_58,
                                                  "*Lexer(\"0xffff_ffff\"sv).takeU32()",
                                                  "0xffffffffu",(uint *)&gtest_ar_.message_,
                                                  (uint *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_e20);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x17a,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_df8._M_engaged = false;
                                                  buffer_x00118._M_str = "0xffff_ffff";
                                                  buffer_x00118._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00118,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_df8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_int>();
                                                  local_38.data_._0_4_ = 0xffffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_int,unsigned_int>
                                                            (local_58,
                                                  "*Lexer(\"0xffff_ffff\"sv).takeI32()",
                                                  "0xffffffffu",(uint *)&gtest_ar_.message_,
                                                  (uint *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_df8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x17b,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_dd0._M_engaged = false;
                                                  buffer_x00119._M_str = "0xffff_ffff";
                                                  buffer_x00119._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00119,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_dd0);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x41efffffffe00000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"0xffff_ffff\"sv).takeF64()",
                                                  "0xffffffff.p0",(double *)&gtest_ar_.message_,
                                                  (double *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_dd0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x17c,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_da8._M_engaged = false;
                                                  buffer_x00120._M_str = "0xffff_ffff";
                                                  buffer_x00120._M_len = 0xb;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00120,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_da8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x4f800000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"0xffff_ffff\"sv).takeF32()",
                                                  "0xffffffff.p0f",(float *)&gtest_ar_.message_,
                                                  (float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_da8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x17d,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_d80._M_engaged = false;
                                                  buffer_x00121._M_str = "0x1_0000_0000";
                                                  buffer_x00121._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00121,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d80);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_d80);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"0x1_0000_0000\"sv).empty()",
                                                               "true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x17f,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_d58._M_engaged = false;
                                                  buffer_x00122._M_str = "0x1_0000_0000";
                                                  buffer_x00122._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00122,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d58);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_19;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_d58);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2595df,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x180,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_d30._M_engaged = false;
                                                  buffer_x00123._M_str = "0x1_0000_0000";
                                                  buffer_x00123._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00123,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d30);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_20;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_d30);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259612,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x181,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_d08._M_engaged = false;
                                                  buffer_x00124._M_str = "0x1_0000_0000";
                                                  buffer_x00124._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00124,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d08);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_d08);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"0x1_0000_0000\"sv).takeU32()","true",
                                                  "false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x182,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_ce0._M_engaged = false;
                                                  buffer_x00125._M_str = "0x1_0000_0000";
                                                  buffer_x00125._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00125,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_ce0);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeI<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_ce0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"0x1_0000_0000\"sv).takeI32()","true",
                                                  "false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x183,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_cb8._M_engaged = false;
                                                  buffer_x00126._M_str = "0x1_0000_0000";
                                                  buffer_x00126._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00126,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_cb8);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_cb8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259636,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x184,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_c90._M_engaged = false;
                                                  buffer_x00127._M_str = "0x1_0000_0000";
                                                  buffer_x00127._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00127,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_c90);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_22;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_c90);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259669,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x185,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_c68._M_engaged = false;
                                                  buffer_x00128._M_str = "0x1_0000_0000";
                                                  buffer_x00128._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00128,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_c68);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)&DAT_100000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0x1_0000_0000\"sv).takeU64()",
                                                  "0x100000000ull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_c68);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x186,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_c40._M_engaged = false;
                                                  buffer_x00129._M_str = "0x1_0000_0000";
                                                  buffer_x00129._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00129,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_c40);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)&DAT_100000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0x1_0000_0000\"sv).takeI64()",
                                                  "0x100000000ull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_c40);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x187,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_c18._M_engaged = false;
                                                  buffer_x00130._M_str = "0x1_0000_0000";
                                                  buffer_x00130._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00130,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_c18);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x41f0000000000000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"0x1_0000_0000\"sv).takeF64()",
                                                  "0x100000000.p0",(double *)&gtest_ar_.message_,
                                                  (double *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_c18);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x188,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_bf0._M_engaged = false;
                                                  buffer_x00131._M_str = "0x1_0000_0000";
                                                  buffer_x00131._M_len = 0xd;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00131,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_bf0);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x4f800000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"0x1_0000_0000\"sv).takeF32()",
                                                  "0x100000000.p0f",(float *)&gtest_ar_.message_,
                                                  (float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_bf0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x189,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_bc8._M_engaged = false;
                                                  buffer_x00132._M_str = "+0xffff_ffff";
                                                  buffer_x00132._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00132,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_bc8);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_bc8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0xffff_ffff\"sv).empty()",
                                                               "true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x18b,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_ba0._M_engaged = false;
                                                  buffer_x00133._M_str = "+0xffff_ffff";
                                                  buffer_x00133._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00133,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_ba0);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_58[0] = (internal)(~extraout_DL_21 & 1);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_ba0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0xffff_ffff\"sv).takeU64()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x18c,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_b78._M_engaged = false;
                                                  buffer_x00134._M_str = "+0xffff_ffff";
                                                  buffer_x00134._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00134,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_b78);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_22;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_b78);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259730,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x18d,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_b50._M_engaged = false;
                                                  buffer_x00135._M_str = "+0xffff_ffff";
                                                  buffer_x00135._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00135,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_b50);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_b50);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0xffff_ffff\"sv).takeU32()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x18e,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_b28._M_engaged = false;
                                                  buffer_x00136._M_str = "+0xffff_ffff";
                                                  buffer_x00136._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00136,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_b28);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeI<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_b28);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0xffff_ffff\"sv).takeI32()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,399,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_b00._M_engaged = false;
                                                  buffer_x00137._M_str = "+0xffff_ffff";
                                                  buffer_x00137._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00137,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_b00);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_b00);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259753,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,400,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_ad8._M_engaged = false;
                                                  buffer_x00138._M_str = "+0xffff_ffff";
                                                  buffer_x00138._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00138,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_ad8);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_23;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_ad8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259776,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x191,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_ab0._M_engaged = false;
                                                  buffer_x00139._M_str = "+0xffff_ffff";
                                                  buffer_x00139._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00139,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_ab0);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ = (AssertHelperData *)0xffffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"+0xffff_ffff\"sv).takeI64()",
                                                  "0xffffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_ab0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x192,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_a88._M_engaged = false;
                                                  buffer_x00140._M_str = "+0xffff_ffff";
                                                  buffer_x00140._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00140,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a88);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x41efffffffe00000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"+0xffff_ffff\"sv).takeF64()",
                                                  "0xffffffff.p0",(double *)&gtest_ar_.message_,
                                                  (double *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_a88);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x193,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_a60._M_engaged = false;
                                                  buffer_x00141._M_str = "+0xffff_ffff";
                                                  buffer_x00141._M_len = 0xc;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00141,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a60);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x4f800000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"+0xffff_ffff\"sv).takeF32()",
                                                  "0xffffffff.p0f",(float *)&gtest_ar_.message_,
                                                  (float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_a60);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x194,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_a38._M_engaged = false;
                                                  buffer_x00142._M_str = "+0x1_0000_0000";
                                                  buffer_x00142._M_len = 0xe;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00142,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a38);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_a38);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                               "Lexer(\"+0x1_0000_0000\"sv).empty()"
                                                               ,"true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x196,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_a10._M_engaged = false;
                                                  buffer_x00143._M_str = "+0x1_0000_0000";
                                                  buffer_x00143._M_len = 0xe;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00143,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_a10);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_58[0] = (internal)(~extraout_DL_23 & 1);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_a10);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0x1_0000_0000\"sv).takeU64()","true",
                                                  "false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x197,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_9e8._M_engaged = false;
                                                  buffer_x00144._M_str = "+0x1_0000_0000";
                                                  buffer_x00144._M_len = 0xe;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00144,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_9e8);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_24;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_9e8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259836,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x198,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_9c0._M_engaged = false;
                                                  buffer_x00145._M_str = "+0x1_0000_0000";
                                                  buffer_x00145._M_len = 0xe;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00145,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_9c0);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_9c0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0x1_0000_0000\"sv).takeU32()","true",
                                                  "false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x199,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_998._M_engaged = false;
                                                  buffer_x00146._M_str = "+0x1_0000_0000";
                                                  buffer_x00146._M_len = 0xe;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00146,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_998);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeI<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_998);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0x1_0000_0000\"sv).takeI32()","true",
                                                  "false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x19a,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_970._M_engaged = false;
                                                  buffer_x00147._M_str = "+0x1_0000_0000";
                                                  buffer_x00147._M_len = 0xe;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00147,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_970);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_970);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x25985b,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x19b,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_948._M_engaged = false;
                                                  buffer_x00148._M_str = "+0x1_0000_0000";
                                                  buffer_x00148._M_len = 0xe;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00148,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_948);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_24;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_948);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259880,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x19c,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_920._M_engaged = false;
                                                  buffer_x00149._M_str = "+0x1_0000_0000";
                                                  buffer_x00149._M_len = 0xe;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00149,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_920);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)&DAT_100000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"+0x1_0000_0000\"sv).takeI64()",
                                                  "0x100000000ull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_920);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x19d,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_8f8._M_engaged = false;
                                                  buffer_x00150._M_str = "+0x1_0000_0000";
                                                  buffer_x00150._M_len = 0xe;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00150,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_8f8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x41f0000000000000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"+0x1_0000_0000\"sv).takeF64()",
                                                  "0x100000000.p0",(double *)&gtest_ar_.message_,
                                                  (double *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_8f8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x19e,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_8d0._M_engaged = false;
                                                  buffer_x00151._M_str = "+0x1_0000_0000";
                                                  buffer_x00151._M_len = 0xe;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00151,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_8d0);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x4f800000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"+0x1_0000_0000\"sv).takeF32()",
                                                  "0x100000000.p0f",(float *)&gtest_ar_.message_,
                                                  (float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_8d0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x19f,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_8a8._M_engaged = false;
                                                  buffer_x00152._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00152._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00152,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_8a8);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_8a8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"0x7fff_ffff_ffff_ffff\"sv).empty()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1a1,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_880._M_engaged = false;
                                                  buffer_x00153._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00153._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00153,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_880);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_25;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_880);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259924,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1a2,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_858._M_engaged = false;
                                                  buffer_x00154._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00154._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00154,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_858);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_26;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_858);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259966,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1a3,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_830._M_engaged = false;
                                                  buffer_x00155._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00155._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00155,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_830);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_830);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"0x7fff_ffff_ffff_ffff\"sv).takeU32()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1a4,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_808._M_engaged = false;
                                                  buffer_x00156._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00156._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00156,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_808);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeI<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_808);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"0x7fff_ffff_ffff_ffff\"sv).takeI32()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1a5,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_7e0._M_engaged = false;
                                                  buffer_x00157._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00157._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00157,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_7e0);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_7e0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259992,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1a6,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_7b8._M_engaged = false;
                                                  buffer_x00158._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00158._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00158,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_7b8);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_25;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_7b8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x2599d4,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1a7,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_790._M_engaged = false;
                                                  buffer_x00159._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00159._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00159,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_790);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x7fffffffffffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0x7fff_ffff_ffff_ffff\"sv).takeU64()",
                                                  "0x7fffffffffffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_790);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1a8,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_768._M_engaged = false;
                                                  buffer_x00160._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00160._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00160,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_768);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x7fffffffffffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0x7fff_ffff_ffff_ffff\"sv).takeI64()",
                                                  "0x7fffffffffffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_768);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1a9,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_740._M_engaged = false;
                                                  buffer_x00161._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00161._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00161,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_740);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x43e0000000000000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"0x7fff_ffff_ffff_ffff\"sv).takeF64()",
                                                  "0x7fffffffffffffff.p0",
                                                  (double *)&gtest_ar_.message_,(double *)&local_38)
                                                  ;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_740);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1aa,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_718._M_engaged = false;
                                                  buffer_x00162._M_str = "0x7fff_ffff_ffff_ffff";
                                                  buffer_x00162._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00162,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_718);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x5f000000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"0x7fff_ffff_ffff_ffff\"sv).takeF32()",
                                                  "0x7fffffffffffffff.p0f",
                                                  (float *)&gtest_ar_.message_,(float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_718);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1ac,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_6f0._M_engaged = false;
                                                  buffer_x00163._M_str = "+0x7fff_ffff_ffff_ffff";
                                                  buffer_x00163._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00163,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_6f0);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_6f0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0x7fff_ffff_ffff_ffff\"sv).empty()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1ae,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_6c8._M_engaged = false;
                                                  buffer_x00164._M_str = "+0x7fff_ffff_ffff_ffff";
                                                  buffer_x00164._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00164,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_6c8);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_58[0] = (internal)(~extraout_DL_27 & 1);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_6c8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0x7fff_ffff_ffff_ffff\"sv).takeU64()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1af,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_6a0._M_engaged = false;
                                                  buffer_x00165._M_str = "+0x7fff_ffff_ffff_ffff";
                                                  buffer_x00165._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00165,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_6a0);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_28;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_6a0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259adc,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1b0,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_678._M_engaged = false;
                                                  buffer_x00166._M_str = "+0x7fff_ffff_ffff_ffff";
                                                  buffer_x00166._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00166,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_678);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_678);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0x7fff_ffff_ffff_ffff\"sv).takeU32()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1b1,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_650._M_engaged = false;
                                                  buffer_x00167._M_str = "+0x7fff_ffff_ffff_ffff";
                                                  buffer_x00167._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00167,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_650);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeI<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_650);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0x7fff_ffff_ffff_ffff\"sv).takeI32()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1b2,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_628._M_engaged = false;
                                                  buffer_x00168._M_str = "+0x7fff_ffff_ffff_ffff";
                                                  buffer_x00168._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00168,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_628);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_628);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259b09,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1b3,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_600._M_engaged = false;
                                                  buffer_x00169._M_str = "+0x7fff_ffff_ffff_ffff";
                                                  buffer_x00169._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00169,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_600);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_26;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_600);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259b36,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1b4,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_5d8._M_engaged = false;
                                                  buffer_x00170._M_str = "+0x7fff_ffff_ffff_ffff";
                                                  buffer_x00170._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00170,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_5d8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x7fffffffffffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"+0x7fff_ffff_ffff_ffff\"sv).takeI64()",
                                                  "0x7fffffffffffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_5d8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1b6,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_5b0._M_engaged = false;
                                                  buffer_x00171._M_str = "+0x7fff_ffff_ffff_ffff";
                                                  buffer_x00171._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00171,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_5b0);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x43e0000000000000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"+0x7fff_ffff_ffff_ffff\"sv).takeF64()",
                                                  "0x7fffffffffffffff.p0",
                                                  (double *)&gtest_ar_.message_,(double *)&local_38)
                                                  ;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_5b0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1b8,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_588._M_engaged = false;
                                                  buffer_x00172._M_str = "+0x7fff_ffff_ffff_ffff";
                                                  buffer_x00172._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00172,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_588);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x5f000000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"+0x7fff_ffff_ffff_ffff\"sv).takeF32()",
                                                  "0x7fffffffffffffff.p0f",
                                                  (float *)&gtest_ar_.message_,(float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_588);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1ba,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_560._M_engaged = false;
                                                  buffer_x00173._M_str = "-0x8000_0000_0000_0000";
                                                  buffer_x00173._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00173,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_560);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_560);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"-0x8000_0000_0000_0000\"sv).empty()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1bc,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_538._M_engaged = false;
                                                  buffer_x00174._M_str = "-0x8000_0000_0000_0000";
                                                  buffer_x00174._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00174,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_538);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_58[0] = (internal)(~extraout_DL_29 & 1);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_538);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"-0x8000_0000_0000_0000\"sv).takeU64()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1bd,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_510._M_engaged = false;
                                                  buffer_x00175._M_str = "-0x8000_0000_0000_0000";
                                                  buffer_x00175._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00175,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_510);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_30;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_510);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259c28,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1be,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_4e8._M_engaged = false;
                                                  buffer_x00176._M_str = "-0x8000_0000_0000_0000";
                                                  buffer_x00176._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00176,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_4e8);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_4e8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"-0x8000_0000_0000_0000\"sv).takeU32()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1bf,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_4c0._M_engaged = false;
                                                  buffer_x00177._M_str = "-0x8000_0000_0000_0000";
                                                  buffer_x00177._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00177,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_4c0);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeI<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_4c0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"-0x8000_0000_0000_0000\"sv).takeI32()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1c0,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_498._M_engaged = false;
                                                  buffer_x00178._M_str = "-0x8000_0000_0000_0000";
                                                  buffer_x00178._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00178,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_498);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_498);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259c6c,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1c1,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_470._M_engaged = false;
                                                  buffer_x00179._M_str = "-0x8000_0000_0000_0000";
                                                  buffer_x00179._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00179,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_470);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_27;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_470);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259cb0,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1c2,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_448._M_engaged = false;
                                                  buffer_x00180._M_str = "-0x8000_0000_0000_0000";
                                                  buffer_x00180._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00180,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_448);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)&DAT_8000000000000000;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"-0x8000_0000_0000_0000\"sv).takeI64()",
                                                  "-0x8000000000000000ull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_448);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1c4,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_420._M_engaged = false;
                                                  buffer_x00181._M_str = "-0x8000_0000_0000_0000";
                                                  buffer_x00181._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00181,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_420);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0xc3e0000000000000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"-0x8000_0000_0000_0000\"sv).takeF64()",
                                                  "-0x8000000000000000.p0",
                                                  (double *)&gtest_ar_.message_,(double *)&local_38)
                                                  ;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_420);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1c6,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_3f8._M_engaged = false;
                                                  buffer_x00182._M_str = "-0x8000_0000_0000_0000";
                                                  buffer_x00182._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00182,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_3f8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0xdf000000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"-0x8000_0000_0000_0000\"sv).takeF32()",
                                                  "-0x8000000000000000.p0f",
                                                  (float *)&gtest_ar_.message_,(float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_3f8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1c8,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_3d0._M_engaged = false;
                                                  buffer_x00183._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00183._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00183,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_3d0);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_3d0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"0xffff_ffff_ffff_ffff\"sv).empty()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1ca,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_3a8._M_engaged = false;
                                                  buffer_x00184._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00184._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00184,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_3a8);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_31;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_3a8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259d74,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1cb,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_380._M_engaged = false;
                                                  buffer_x00185._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00185._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00185,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_380);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_DL_32;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_380);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259db6,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1cc,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_358._M_engaged = false;
                                                  buffer_x00186._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00186._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00186,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_358);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_358);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"0xffff_ffff_ffff_ffff\"sv).takeU32()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1cd,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_330._M_engaged = false;
                                                  buffer_x00187._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00187._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00187,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_330);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeI<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_330);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"0xffff_ffff_ffff_ffff\"sv).takeI32()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1ce,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_308._M_engaged = false;
                                                  buffer_x00188._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00188._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00188,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_308);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_308);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259de2,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1cf,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_2e0._M_engaged = false;
                                                  buffer_x00189._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00189._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00189,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_2e0);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_28;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_2e0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259e24,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1d0,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_2b8._M_engaged = false;
                                                  buffer_x00190._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00190._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00190,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_2b8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0xffffffffffffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0xffff_ffff_ffff_ffff\"sv).takeU64()",
                                                  "0xffffffffffffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_2b8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1d1,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_290._M_engaged = false;
                                                  buffer_x00191._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00191._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00191,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_290);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0xffffffffffffffff;
                                                  testing::internal::
                                                  CmpHelperEQ<unsigned_long,unsigned_long_long>
                                                            (local_58,
                                                  "*Lexer(\"0xffff_ffff_ffff_ffff\"sv).takeI64()",
                                                  "0xffffffffffffffffull",
                                                  (unsigned_long *)&gtest_ar_.message_,
                                                  (unsigned_long_long *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_290);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1d2,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_268._M_engaged = false;
                                                  buffer_x00192._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00192._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00192,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_268);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x43f0000000000000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"0xffff_ffff_ffff_ffff\"sv).takeF64()",
                                                  "0xffffffffffffffff.p0",
                                                  (double *)&gtest_ar_.message_,(double *)&local_38)
                                                  ;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_268);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1d3,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_240._M_engaged = false;
                                                  buffer_x00193._M_str = "0xffff_ffff_ffff_ffff";
                                                  buffer_x00193._M_len = 0x15;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00193,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_240);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x5f800000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"0xffff_ffff_ffff_ffff\"sv).takeF32()",
                                                  "0xffffffffffffffff.p0f",
                                                  (float *)&gtest_ar_.message_,(float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_240);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1d5,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_218._M_engaged = false;
                                                  buffer_x00194._M_str = "+0xffff_ffff_ffff_ffff";
                                                  buffer_x00194._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00194,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_218);
                                                  local_58[0] = (internal)
                                                                (local_b0.pos !=
                                                                local_b0.buffer._M_len);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_218);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0xffff_ffff_ffff_ffff\"sv).empty()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1d7,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1f0._M_engaged = false;
                                                  buffer_x00195._M_str = "+0xffff_ffff_ffff_ffff";
                                                  buffer_x00195._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00195,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1f0);
                                                  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
                                                  local_58[0] = (internal)(~extraout_DL_33 & 1);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1f0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0xffff_ffff_ffff_ffff\"sv).takeU64()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1d8,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1c8._M_engaged = false;
                                                  buffer_x00196._M_str = "+0xffff_ffff_ffff_ffff";
                                                  buffer_x00196._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00196,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1c8);
                                                  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
                                                  local_58[0] = (internal)(~extraout_DL_34 & 1);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1c8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0xffff_ffff_ffff_ffff\"sv).takeI64()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1d9,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_1a0._M_engaged = false;
                                                  buffer_x00197._M_str = "+0xffff_ffff_ffff_ffff";
                                                  buffer_x00197._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00197,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_1a0);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeU<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_1a0);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0xffff_ffff_ffff_ffff\"sv).takeU32()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1da,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_178._M_engaged = false;
                                                  buffer_x00198._M_str = "+0xffff_ffff_ffff_ffff";
                                                  buffer_x00198._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00198,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_178);
                                                  uVar4 = ::wasm::WATParser::Lexer::
                                                          takeI<unsigned_int>();
                                                  local_58[0] = (internal)
                                                                ((uVar4 & 0x100000000) == 0);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_178);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Lexer(\"+0xffff_ffff_ffff_ffff\"sv).takeI32()",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1db,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_38);
                                                  std::__cxx11::string::~string((string *)&local_b0)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl !=
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_150._M_engaged = false;
                                                  buffer_x00199._M_str = "+0xffff_ffff_ffff_ffff";
                                                  buffer_x00199._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00199,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_150);
                                                  local_58[0] = (internal)
                                                                ::wasm::WATParser::Lexer::takeF64();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_150);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&local_b0,local_58,
                                                               (AssertionResult *)0x259f58,"false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_38,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1dc,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  else {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_128._M_engaged = false;
                                                  buffer_x00200._M_str = "+0xffff_ffff_ffff_ffff";
                                                  buffer_x00200._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00200,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_128);
                                                  ::wasm::WATParser::Lexer::takeF32();
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  local_58[0] = extraout_var_29;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_128);
                                                  if (local_58[0] != (internal)0x0) {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_100._M_engaged = false;
                                                  buffer_x00201._M_str = "+0xffff_ffff_ffff_ffff";
                                                  buffer_x00201._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00201,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF64();
                                                  local_38.data_ =
                                                       (AssertHelperData *)0x43f0000000000000;
                                                  testing::internal::CmpHelperEQ<double,double>
                                                            (local_58,
                                                  "*Lexer(\"+0xffff_ffff_ffff_ffff\"sv).takeF64()",
                                                  "0xffffffffffffffff.p0",
                                                  (double *)&gtest_ar_.message_,(double *)&local_38)
                                                  ;
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_100);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1df,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr((
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&gtest_ar_);
                                                  local_d8._M_engaged = false;
                                                  buffer_x00202._M_str = "+0xffff_ffff_ffff_ffff";
                                                  buffer_x00202._M_len = 0x16;
                                                  ::wasm::WATParser::Lexer::Lexer
                                                            (&local_b0,buffer_x00202,
                                                             (
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8);
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )::wasm::WATParser::Lexer::takeF32();
                                                  local_38.data_._0_4_ = 0x5f800000;
                                                  testing::internal::CmpHelperEQ<float,float>
                                                            (local_58,
                                                  "*Lexer(\"+0xffff_ffff_ffff_ffff\"sv).takeF32()",
                                                  "0xffffffffffffffff.p0f",
                                                  (float *)&gtest_ar_.message_,(float *)&local_38);
                                                  ::wasm::WATParser::Lexer::~Lexer(&local_b0);
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset(&local_d8);
                                                  if (local_58[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_b0);
                                                    if (gtest_ar_._0_8_ == 0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = *(char **)gtest_ar_._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1e1,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  if ((long *)local_b0.pos != (long *)0x0) {
                                                    (**(code **)(*(long *)local_b0.pos + 8))();
                                                  }
                                                  }
                                                  goto LAB_0020d985;
                                                  }
                                                  testing::Message::Message
                                                            ((Message *)&gtest_ar_.message_);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&local_b0,local_58,
                                                             (AssertionResult *)0x259f85,"false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_38,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                                                  ,0x1dd,(char *)local_b0.pos);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_38,
                                                             (Message *)&gtest_ar_.message_);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  std::__cxx11::string::~string((string *)&local_b0);
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_0020d985:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  return;
}

Assistant:

TEST(LexerTest, ClassifyInt) {
  ASSERT_FALSE(Lexer("0"sv).empty());
  ASSERT_TRUE(Lexer("0"sv).takeU64());
  ASSERT_TRUE(Lexer("0"sv).takeI64());
  ASSERT_TRUE(Lexer("0"sv).takeU32());
  ASSERT_TRUE(Lexer("0"sv).takeI32());
  ASSERT_TRUE(Lexer("0"sv).takeF64());
  ASSERT_TRUE(Lexer("0"sv).takeF32());
  EXPECT_EQ(*Lexer("0"sv).takeU64(), 0ull);
  EXPECT_EQ(*Lexer("0"sv).takeI64(), 0ull);
  EXPECT_EQ(*Lexer("0"sv).takeU32(), 0u);
  EXPECT_EQ(*Lexer("0"sv).takeI32(), 0u);
  EXPECT_EQ(*Lexer("0"sv).takeF64(), 0.0);
  EXPECT_EQ(*Lexer("0"sv).takeF32(), 0.0);
  EXPECT_FALSE(std::signbit(*Lexer("0"sv).takeF64()));
  EXPECT_FALSE(std::signbit(*Lexer("0"sv).takeF32()));

  ASSERT_FALSE(Lexer("+0"sv).empty());
  EXPECT_FALSE(Lexer("+0"sv).takeU64());
  ASSERT_TRUE(Lexer("+0"sv).takeI64());
  EXPECT_FALSE(Lexer("+0"sv).takeU32());
  ASSERT_TRUE(Lexer("+0"sv).takeI32());
  ASSERT_TRUE(Lexer("+0"sv).takeF64());
  ASSERT_TRUE(Lexer("+0"sv).takeF32());
  EXPECT_EQ(*Lexer("+0"sv).takeI64(), 0ull);
  EXPECT_EQ(*Lexer("+0"sv).takeI32(), 0u);
  EXPECT_EQ(*Lexer("+0"sv).takeF64(), 0.0);
  EXPECT_EQ(*Lexer("+0"sv).takeF32(), 0.0);
  EXPECT_FALSE(std::signbit(*Lexer("+0"sv).takeF64()));
  EXPECT_FALSE(std::signbit(*Lexer("+0"sv).takeF32()));

  ASSERT_FALSE(Lexer("-0"sv).empty());
  EXPECT_FALSE(Lexer("-0"sv).takeU64());
  ASSERT_TRUE(Lexer("-0"sv).takeI64());
  EXPECT_FALSE(Lexer("-0"sv).takeU32());
  ASSERT_TRUE(Lexer("-0"sv).takeI32());
  ASSERT_TRUE(Lexer("-0"sv).takeF64());
  ASSERT_TRUE(Lexer("-0"sv).takeF32());
  EXPECT_EQ(*Lexer("-0"sv).takeI64(), 0ull);
  EXPECT_EQ(*Lexer("-0"sv).takeI32(), 0u);
  EXPECT_EQ(*Lexer("-0"sv).takeF64(), -0.0);
  EXPECT_EQ(*Lexer("-0"sv).takeF32(), -0.0);
  ASSERT_TRUE(std::signbit(*Lexer("-0"sv).takeF64()));
  ASSERT_TRUE(std::signbit(*Lexer("-0"sv).takeF32()));

  ASSERT_FALSE(Lexer("0x7fff_ffff"sv).empty());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeI64());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeU32());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeU64(), 0x7fffffffull);
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeI64(), 0x7fffffffull);
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeU32(), 0x7fffffffu);
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeI32(), 0x7fffffffu);
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeF64(), 0x7fffffff.p0);
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeF32(), 0x7fffffff.p0f);

  ASSERT_FALSE(Lexer("0x8000_0000"sv).empty());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeI64());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeU32());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeU64(), 0x80000000ull);
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeI64(), 0x80000000ull);
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeU32(), 0x80000000u);
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeI32(), 0x80000000u);
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeF64(), 0x80000000.p0);
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeF32(), 0x80000000.p0f);

  ASSERT_FALSE(Lexer("+0x7fff_ffff"sv).empty());
  EXPECT_FALSE(Lexer("+0x7fff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("+0x7fff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("+0x7fff_ffff"sv).takeU32());
  ASSERT_TRUE(Lexer("+0x7fff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("+0x7fff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("+0x7fff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("+0x7fff_ffff"sv).takeI64(), 0x7fffffffull);
  EXPECT_EQ(*Lexer("+0x7fff_ffff"sv).takeI32(), 0x7fffffffu);
  EXPECT_EQ(*Lexer("+0x7fff_ffff"sv).takeF64(), 0x7fffffff.p0);
  EXPECT_EQ(*Lexer("+0x7fff_ffff"sv).takeF32(), 0x7fffffff.p0f);

  ASSERT_FALSE(Lexer("+0x8000_0000"sv).empty());
  EXPECT_FALSE(Lexer("+0x8000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("+0x8000_0000"sv).takeI64());
  EXPECT_FALSE(Lexer("+0x8000_0000"sv).takeU32());
  EXPECT_FALSE(Lexer("+0x8000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("+0x8000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("+0x8000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("+0x8000_0000"sv).takeI64(), 0x80000000ull);
  EXPECT_EQ(*Lexer("+0x8000_0000"sv).takeF64(), 0x80000000.p0);
  EXPECT_EQ(*Lexer("+0x8000_0000"sv).takeF32(), 0x80000000.p0f);

  ASSERT_FALSE(Lexer("-0x8000_0000"sv).empty());
  EXPECT_FALSE(Lexer("-0x8000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("-0x8000_0000"sv).takeI64());
  EXPECT_FALSE(Lexer("-0x8000_0000"sv).takeU32());
  ASSERT_TRUE(Lexer("-0x8000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("-0x8000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("-0x8000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("-0x8000_0000"sv).takeI64(), -0x80000000ull);
  EXPECT_EQ(*Lexer("-0x8000_0000"sv).takeI32(), -0x80000000u);
  EXPECT_EQ(*Lexer("-0x8000_0000"sv).takeF64(), -0x80000000.p0);
  EXPECT_EQ(*Lexer("-0x8000_0000"sv).takeF32(), -0x80000000.p0f);

  ASSERT_FALSE(Lexer("-0x8000_0001"sv).empty());
  EXPECT_FALSE(Lexer("-0x8000_0001"sv).takeU64());
  ASSERT_TRUE(Lexer("-0x8000_0001"sv).takeI64());
  EXPECT_FALSE(Lexer("-0x8000_0001"sv).takeU32());
  EXPECT_FALSE(Lexer("-0x8000_0001"sv).takeI32());
  ASSERT_TRUE(Lexer("-0x8000_0001"sv).takeF64());
  ASSERT_TRUE(Lexer("-0x8000_0001"sv).takeF32());
  EXPECT_EQ(*Lexer("-0x8000_0001"sv).takeI64(), -0x80000001ull);
  EXPECT_EQ(*Lexer("-0x8000_0001"sv).takeF64(), -0x80000001.p0);
  EXPECT_EQ(*Lexer("-0x8000_0001"sv).takeF32(), -0x80000001.p0f);

  ASSERT_FALSE(Lexer("0xffff_ffff"sv).empty());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeI64());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeU32());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeU64(), 0xffffffffull);
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeI64(), 0xffffffffull);
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeU32(), 0xffffffffu);
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeI32(), 0xffffffffu);
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeF64(), 0xffffffff.p0);
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeF32(), 0xffffffff.p0f);

  ASSERT_FALSE(Lexer("0x1_0000_0000"sv).empty());
  ASSERT_TRUE(Lexer("0x1_0000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("0x1_0000_0000"sv).takeI64());
  EXPECT_FALSE(Lexer("0x1_0000_0000"sv).takeU32());
  EXPECT_FALSE(Lexer("0x1_0000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("0x1_0000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("0x1_0000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("0x1_0000_0000"sv).takeU64(), 0x100000000ull);
  EXPECT_EQ(*Lexer("0x1_0000_0000"sv).takeI64(), 0x100000000ull);
  EXPECT_EQ(*Lexer("0x1_0000_0000"sv).takeF64(), 0x100000000.p0);
  EXPECT_EQ(*Lexer("0x1_0000_0000"sv).takeF32(), 0x100000000.p0f);

  ASSERT_FALSE(Lexer("+0xffff_ffff"sv).empty());
  EXPECT_FALSE(Lexer("+0xffff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("+0xffff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("+0xffff_ffff"sv).takeU32());
  EXPECT_FALSE(Lexer("+0xffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("+0xffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("+0xffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("+0xffff_ffff"sv).takeI64(), 0xffffffffull);
  EXPECT_EQ(*Lexer("+0xffff_ffff"sv).takeF64(), 0xffffffff.p0);
  EXPECT_EQ(*Lexer("+0xffff_ffff"sv).takeF32(), 0xffffffff.p0f);

  ASSERT_FALSE(Lexer("+0x1_0000_0000"sv).empty());
  EXPECT_FALSE(Lexer("+0x1_0000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("+0x1_0000_0000"sv).takeI64());
  EXPECT_FALSE(Lexer("+0x1_0000_0000"sv).takeU32());
  EXPECT_FALSE(Lexer("+0x1_0000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("+0x1_0000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("+0x1_0000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("+0x1_0000_0000"sv).takeI64(), 0x100000000ull);
  EXPECT_EQ(*Lexer("+0x1_0000_0000"sv).takeF64(), 0x100000000.p0);
  EXPECT_EQ(*Lexer("+0x1_0000_0000"sv).takeF32(), 0x100000000.p0f);

  ASSERT_FALSE(Lexer("0x7fff_ffff_ffff_ffff"sv).empty());
  ASSERT_TRUE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeU32());
  EXPECT_FALSE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("0x7fff_ffff_ffff_ffff"sv).takeU64(), 0x7fffffffffffffffull);
  EXPECT_EQ(*Lexer("0x7fff_ffff_ffff_ffff"sv).takeI64(), 0x7fffffffffffffffull);
  EXPECT_EQ(*Lexer("0x7fff_ffff_ffff_ffff"sv).takeF64(), 0x7fffffffffffffff.p0);
  EXPECT_EQ(*Lexer("0x7fff_ffff_ffff_ffff"sv).takeF32(),
            0x7fffffffffffffff.p0f);

  ASSERT_FALSE(Lexer("+0x7fff_ffff_ffff_ffff"sv).empty());
  EXPECT_FALSE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeU32());
  EXPECT_FALSE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("+0x7fff_ffff_ffff_ffff"sv).takeI64(),
            0x7fffffffffffffffull);
  EXPECT_EQ(*Lexer("+0x7fff_ffff_ffff_ffff"sv).takeF64(),
            0x7fffffffffffffff.p0);
  EXPECT_EQ(*Lexer("+0x7fff_ffff_ffff_ffff"sv).takeF32(),
            0x7fffffffffffffff.p0f);

  ASSERT_FALSE(Lexer("-0x8000_0000_0000_0000"sv).empty());
  EXPECT_FALSE(Lexer("-0x8000_0000_0000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("-0x8000_0000_0000_0000"sv).takeI64());
  EXPECT_FALSE(Lexer("-0x8000_0000_0000_0000"sv).takeU32());
  EXPECT_FALSE(Lexer("-0x8000_0000_0000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("-0x8000_0000_0000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("-0x8000_0000_0000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("-0x8000_0000_0000_0000"sv).takeI64(),
            -0x8000000000000000ull);
  EXPECT_EQ(*Lexer("-0x8000_0000_0000_0000"sv).takeF64(),
            -0x8000000000000000.p0);
  EXPECT_EQ(*Lexer("-0x8000_0000_0000_0000"sv).takeF32(),
            -0x8000000000000000.p0f);

  ASSERT_FALSE(Lexer("0xffff_ffff_ffff_ffff"sv).empty());
  ASSERT_TRUE(Lexer("0xffff_ffff_ffff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("0xffff_ffff_ffff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("0xffff_ffff_ffff_ffff"sv).takeU32());
  EXPECT_FALSE(Lexer("0xffff_ffff_ffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("0xffff_ffff_ffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("0xffff_ffff_ffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("0xffff_ffff_ffff_ffff"sv).takeU64(), 0xffffffffffffffffull);
  EXPECT_EQ(*Lexer("0xffff_ffff_ffff_ffff"sv).takeI64(), 0xffffffffffffffffull);
  EXPECT_EQ(*Lexer("0xffff_ffff_ffff_ffff"sv).takeF64(), 0xffffffffffffffff.p0);
  EXPECT_EQ(*Lexer("0xffff_ffff_ffff_ffff"sv).takeF32(),
            0xffffffffffffffff.p0f);

  ASSERT_FALSE(Lexer("+0xffff_ffff_ffff_ffff"sv).empty());
  EXPECT_FALSE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeU64());
  EXPECT_FALSE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeU32());
  EXPECT_FALSE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("+0xffff_ffff_ffff_ffff"sv).takeF64(),
            0xffffffffffffffff.p0);
  EXPECT_EQ(*Lexer("+0xffff_ffff_ffff_ffff"sv).takeF32(),
            0xffffffffffffffff.p0f);
}